

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [32];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [28];
  undefined1 auVar79 [12];
  undefined1 auVar80 [32];
  byte bVar81;
  uint uVar82;
  int iVar83;
  uint uVar84;
  ulong uVar85;
  long lVar86;
  ulong uVar87;
  ulong uVar88;
  uint uVar89;
  long lVar90;
  bool bVar91;
  undefined8 uVar92;
  float fVar112;
  vint4 bi_2;
  undefined1 auVar93 [16];
  float fVar110;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar99 [32];
  undefined1 auVar97 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar111;
  float fVar113;
  float fVar114;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar98 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined4 uVar118;
  undefined8 uVar119;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 extraout_var [56];
  float fVar134;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 ai_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  vint4 ai;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  vint4 bi;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined4 uVar180;
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  float fVar203;
  undefined1 auVar205 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar209;
  undefined1 auVar204 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  float fVar214;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar213 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_9ad;
  undefined1 local_9a0 [32];
  undefined1 local_960 [32];
  undefined4 local_940;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_730 [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  LinearSpace3fa *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  int local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_380 [32];
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar87 = (ulong)(byte)PVar7;
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar134 = *(float *)(prim + uVar87 * 0x19 + 0x12);
  auVar10 = vsubps_avx(auVar10,*(undefined1 (*) [16])(prim + uVar87 * 0x19 + 6));
  auVar93._0_4_ = fVar134 * auVar10._0_4_;
  auVar93._4_4_ = fVar134 * auVar10._4_4_;
  auVar93._8_4_ = fVar134 * auVar10._8_4_;
  auVar93._12_4_ = fVar134 * auVar10._12_4_;
  auVar162._0_4_ = fVar134 * auVar11._0_4_;
  auVar162._4_4_ = fVar134 * auVar11._4_4_;
  auVar162._8_4_ = fVar134 * auVar11._8_4_;
  auVar162._12_4_ = fVar134 * auVar11._12_4_;
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar7 * 0xc + uVar87 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar85 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + uVar87 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar85 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar210._4_4_ = auVar162._0_4_;
  auVar210._0_4_ = auVar162._0_4_;
  auVar210._8_4_ = auVar162._0_4_;
  auVar210._12_4_ = auVar162._0_4_;
  auVar121 = vshufps_avx(auVar162,auVar162,0x55);
  auVar94 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar134 = auVar94._0_4_;
  auVar198._0_4_ = fVar134 * auVar12._0_4_;
  fVar110 = auVar94._4_4_;
  auVar198._4_4_ = fVar110 * auVar12._4_4_;
  fVar112 = auVar94._8_4_;
  auVar198._8_4_ = fVar112 * auVar12._8_4_;
  fVar135 = auVar94._12_4_;
  auVar198._12_4_ = fVar135 * auVar12._12_4_;
  auVar194._0_4_ = auVar15._0_4_ * fVar134;
  auVar194._4_4_ = auVar15._4_4_ * fVar110;
  auVar194._8_4_ = auVar15._8_4_ * fVar112;
  auVar194._12_4_ = auVar15._12_4_ * fVar135;
  auVar181._0_4_ = auVar136._0_4_ * fVar134;
  auVar181._4_4_ = auVar136._4_4_ * fVar110;
  auVar181._8_4_ = auVar136._8_4_ * fVar112;
  auVar181._12_4_ = auVar136._12_4_ * fVar135;
  auVar94 = vfmadd231ps_fma(auVar198,auVar121,auVar11);
  auVar122 = vfmadd231ps_fma(auVar194,auVar121,auVar14);
  auVar121 = vfmadd231ps_fma(auVar181,auVar95,auVar121);
  auVar150 = vfmadd231ps_fma(auVar94,auVar210,auVar10);
  auVar122 = vfmadd231ps_fma(auVar122,auVar210,auVar13);
  auVar158 = vfmadd231ps_fma(auVar121,auVar96,auVar210);
  auVar211._4_4_ = auVar93._0_4_;
  auVar211._0_4_ = auVar93._0_4_;
  auVar211._8_4_ = auVar93._0_4_;
  auVar211._12_4_ = auVar93._0_4_;
  auVar121 = vshufps_avx(auVar93,auVar93,0x55);
  auVar94 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar134 = auVar94._0_4_;
  auVar163._0_4_ = fVar134 * auVar12._0_4_;
  fVar110 = auVar94._4_4_;
  auVar163._4_4_ = fVar110 * auVar12._4_4_;
  fVar112 = auVar94._8_4_;
  auVar163._8_4_ = fVar112 * auVar12._8_4_;
  fVar135 = auVar94._12_4_;
  auVar163._12_4_ = fVar135 * auVar12._12_4_;
  auVar120._0_4_ = auVar15._0_4_ * fVar134;
  auVar120._4_4_ = auVar15._4_4_ * fVar110;
  auVar120._8_4_ = auVar15._8_4_ * fVar112;
  auVar120._12_4_ = auVar15._12_4_ * fVar135;
  auVar94._0_4_ = auVar136._0_4_ * fVar134;
  auVar94._4_4_ = auVar136._4_4_ * fVar110;
  auVar94._8_4_ = auVar136._8_4_ * fVar112;
  auVar94._12_4_ = auVar136._12_4_ * fVar135;
  auVar11 = vfmadd231ps_fma(auVar163,auVar121,auVar11);
  auVar12 = vfmadd231ps_fma(auVar120,auVar121,auVar14);
  auVar14 = vfmadd231ps_fma(auVar94,auVar121,auVar95);
  auVar15 = vfmadd231ps_fma(auVar11,auVar211,auVar10);
  auVar95 = vfmadd231ps_fma(auVar12,auVar211,auVar13);
  auVar136 = vfmadd231ps_fma(auVar14,auVar211,auVar96);
  local_450._8_4_ = 0x7fffffff;
  local_450._0_8_ = 0x7fffffff7fffffff;
  local_450._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx(auVar150,local_450);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar10 = vcmpps_avx(auVar10,auVar157,1);
  auVar11 = vblendvps_avx(auVar150,auVar157,auVar10);
  auVar10 = vandps_avx(auVar122,local_450);
  auVar10 = vcmpps_avx(auVar10,auVar157,1);
  auVar12 = vblendvps_avx(auVar122,auVar157,auVar10);
  auVar10 = vandps_avx(auVar158,local_450);
  auVar10 = vcmpps_avx(auVar10,auVar157,1);
  auVar10 = vblendvps_avx(auVar158,auVar157,auVar10);
  auVar13 = vrcpps_avx(auVar11);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = &DAT_3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar11 = vfnmadd213ps_fma(auVar11,auVar13,auVar177);
  auVar13 = vfmadd132ps_fma(auVar11,auVar13,auVar13);
  auVar11 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar11,auVar177);
  auVar14 = vfmadd132ps_fma(auVar12,auVar11,auVar11);
  auVar11 = vrcpps_avx(auVar10);
  auVar12 = vfnmadd213ps_fma(auVar10,auVar11,auVar177);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar10 = vpmovsxwd_avx(auVar10);
  auVar96 = vfmadd132ps_fma(auVar12,auVar11,auVar11);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar15);
  auVar158._0_4_ = auVar13._0_4_ * auVar10._0_4_;
  auVar158._4_4_ = auVar13._4_4_ * auVar10._4_4_;
  auVar158._8_4_ = auVar13._8_4_ * auVar10._8_4_;
  auVar158._12_4_ = auVar13._12_4_ * auVar10._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar10 = vpmovsxwd_avx(auVar11);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar15);
  auVar164._0_4_ = auVar13._0_4_ * auVar10._0_4_;
  auVar164._4_4_ = auVar13._4_4_ * auVar10._4_4_;
  auVar164._8_4_ = auVar13._8_4_ * auVar10._8_4_;
  auVar164._12_4_ = auVar13._12_4_ * auVar10._12_4_;
  auVar122._1_3_ = 0;
  auVar122[0] = PVar7;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar11 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar87 * -2 + 6);
  auVar10 = vpmovsxwd_avx(auVar13);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar95);
  auVar182._0_4_ = auVar10._0_4_ * auVar14._0_4_;
  auVar182._4_4_ = auVar10._4_4_ * auVar14._4_4_;
  auVar182._8_4_ = auVar10._8_4_ * auVar14._8_4_;
  auVar182._12_4_ = auVar10._12_4_ * auVar14._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar11);
  auVar10 = vsubps_avx(auVar10,auVar95);
  auVar121._0_4_ = auVar14._0_4_ * auVar10._0_4_;
  auVar121._4_4_ = auVar14._4_4_ * auVar10._4_4_;
  auVar121._8_4_ = auVar14._8_4_ * auVar10._8_4_;
  auVar121._12_4_ = auVar14._12_4_ * auVar10._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar85 + uVar87 + 6);
  auVar10 = vpmovsxwd_avx(auVar14);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar136);
  auVar150._0_4_ = auVar96._0_4_ * auVar10._0_4_;
  auVar150._4_4_ = auVar96._4_4_ * auVar10._4_4_;
  auVar150._8_4_ = auVar96._8_4_ * auVar10._8_4_;
  auVar150._12_4_ = auVar96._12_4_ * auVar10._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar87 * 0x17 + 6);
  auVar10 = vpmovsxwd_avx(auVar15);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar136);
  auVar95._0_4_ = auVar96._0_4_ * auVar10._0_4_;
  auVar95._4_4_ = auVar96._4_4_ * auVar10._4_4_;
  auVar95._8_4_ = auVar96._8_4_ * auVar10._8_4_;
  auVar95._12_4_ = auVar96._12_4_ * auVar10._12_4_;
  auVar10 = vpminsd_avx(auVar158,auVar164);
  auVar11 = vpminsd_avx(auVar182,auVar121);
  auVar10 = vmaxps_avx(auVar10,auVar11);
  auVar11 = vpminsd_avx(auVar150,auVar95);
  uVar118 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar189._4_4_ = uVar118;
  auVar189._0_4_ = uVar118;
  auVar189._8_4_ = uVar118;
  auVar189._12_4_ = uVar118;
  auVar11 = vmaxps_avx(auVar11,auVar189);
  auVar10 = vmaxps_avx(auVar10,auVar11);
  local_460._0_4_ = auVar10._0_4_ * 0.99999964;
  local_460._4_4_ = auVar10._4_4_ * 0.99999964;
  local_460._8_4_ = auVar10._8_4_ * 0.99999964;
  local_460._12_4_ = auVar10._12_4_ * 0.99999964;
  auVar10 = vpmaxsd_avx(auVar158,auVar164);
  auVar11 = vpmaxsd_avx(auVar182,auVar121);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar11 = vpmaxsd_avx(auVar150,auVar95);
  uVar118 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar136._4_4_ = uVar118;
  auVar136._0_4_ = uVar118;
  auVar136._8_4_ = uVar118;
  auVar136._12_4_ = uVar118;
  auVar11 = vminps_avx(auVar11,auVar136);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar96._0_4_ = auVar10._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar10._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar10._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar10._12_4_ * 1.0000004;
  auVar122[4] = PVar7;
  auVar122._5_3_ = 0;
  auVar122[8] = PVar7;
  auVar122._9_3_ = 0;
  auVar122[0xc] = PVar7;
  auVar122._13_3_ = 0;
  auVar11 = vpcmpgtd_avx(auVar122,_DAT_01ff0cf0);
  auVar10 = vcmpps_avx(local_460,auVar96,2);
  auVar10 = vandps_avx(auVar10,auVar11);
  uVar82 = vmovmskps_avx(auVar10);
  local_9ad = uVar82 != 0;
  if (local_9ad) {
    uVar82 = uVar82 & 0xff;
    local_608 = pre->ray_space + k;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    iVar83 = 1 << ((uint)k & 0x1f);
    auVar99._4_4_ = iVar83;
    auVar99._0_4_ = iVar83;
    auVar99._8_4_ = iVar83;
    auVar99._12_4_ = iVar83;
    auVar99._16_4_ = iVar83;
    auVar99._20_4_ = iVar83;
    auVar99._24_4_ = iVar83;
    auVar99._28_4_ = iVar83;
    auVar109 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar99 = vpand_avx2(auVar99,auVar109);
    local_2e0 = vpcmpeqd_avx2(auVar99,auVar109);
    do {
      lVar16 = 0;
      for (uVar85 = (ulong)uVar82; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        lVar16 = lVar16 + 1;
      }
      uVar89 = *(uint *)(prim + 2);
      local_780._4_4_ = *(undefined4 *)(prim + lVar16 * 4 + 6);
      pGVar8 = (context->scene->geometries).items[uVar89].ptr;
      local_5e0._0_8_ = CONCAT44(0,local_780._4_4_);
      uVar85 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               CONCAT44(0,local_780._4_4_) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar90 = (long)pGVar8[1].intersectionFilterN * uVar85;
      lVar86 = (long)pGVar8[1].intersectionFilterN * (uVar85 + 1);
      lVar16 = *(long *)&pGVar8[1].time_range.upper;
      local_730 = *(undefined1 (*) [16])(lVar16 + lVar90);
      local_570 = *(undefined1 (*) [16])(lVar16 + lVar86);
      uVar118 = *(undefined4 *)(lVar16 + 0xc + lVar90);
      auVar178._4_4_ = uVar118;
      auVar178._0_4_ = uVar118;
      auVar178._8_4_ = uVar118;
      auVar178._12_4_ = uVar118;
      local_2a0._16_4_ = uVar118;
      local_2a0._0_16_ = auVar178;
      local_2a0._20_4_ = uVar118;
      local_2a0._24_4_ = uVar118;
      local_2a0._28_4_ = uVar118;
      iVar83 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar134 = *(float *)(lVar16 + 0xc + lVar86);
      auVar212._4_4_ = fVar134;
      auVar212._0_4_ = fVar134;
      auVar212._8_4_ = fVar134;
      auVar212._12_4_ = fVar134;
      fStack_2b0 = fVar134;
      _local_2c0 = auVar212;
      fStack_2ac = fVar134;
      fStack_2a8 = fVar134;
      uStack_2a4 = fVar134;
      lVar16 = (long)iVar83 * 0x44;
      auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar123._8_4_ = 0xbeaaaaab;
      auVar123._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar123._12_4_ = 0xbeaaaaab;
      local_620 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar8[2].intersectionFilterN +
                                    uVar85 * (long)pGVar8[2].pointQueryFunc),local_730,auVar123);
      local_630 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar8[2].intersectionFilterN +
                                   (long)pGVar8[2].pointQueryFunc * (uVar85 + 1)),local_570,auVar123
                                 );
      auVar12 = vsubps_avx(local_730,auVar10);
      uVar118 = auVar12._0_4_;
      auVar137._4_4_ = uVar118;
      auVar137._0_4_ = uVar118;
      auVar137._8_4_ = uVar118;
      auVar137._12_4_ = uVar118;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      aVar4 = (local_608->vx).field_0;
      aVar5 = (local_608->vy).field_0;
      fVar110 = (local_608->vz).field_0.m128[0];
      fVar112 = *(float *)((long)&(local_608->vz).field_0 + 4);
      fVar135 = *(float *)((long)&(local_608->vz).field_0 + 8);
      fVar111 = *(float *)((long)&(local_608->vz).field_0 + 0xc);
      auVar183._0_4_ = fVar110 * auVar12._0_4_;
      auVar183._4_4_ = fVar112 * auVar12._4_4_;
      auVar183._8_4_ = fVar135 * auVar12._8_4_;
      auVar183._12_4_ = fVar111 * auVar12._12_4_;
      auVar11 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar11);
      auVar15 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar4,auVar137);
      auVar13 = vinsertps_avx(auVar15,auVar178,0x30);
      auVar12 = vsubps_avx(local_620,auVar10);
      uVar118 = auVar12._0_4_;
      auVar151._4_4_ = uVar118;
      auVar151._0_4_ = uVar118;
      auVar151._8_4_ = uVar118;
      auVar151._12_4_ = uVar118;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar195._0_4_ = fVar110 * auVar12._0_4_;
      auVar195._4_4_ = fVar112 * auVar12._4_4_;
      auVar195._8_4_ = fVar135 * auVar12._8_4_;
      auVar195._12_4_ = fVar111 * auVar12._12_4_;
      auVar11 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar11);
      auVar96 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar4,auVar151);
      auVar14 = vsubps_avx(local_630,auVar10);
      auVar11 = vshufps_avx(auVar14,auVar14,0x55);
      auVar12 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar179._0_4_ = fVar110 * auVar12._0_4_;
      auVar179._4_4_ = fVar112 * auVar12._4_4_;
      auVar179._8_4_ = fVar135 * auVar12._8_4_;
      auVar179._12_4_ = fVar111 * auVar12._12_4_;
      auVar12 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar11);
      auVar11 = vblendps_avx(auVar96,local_620,8);
      auVar138._0_4_ = auVar14._0_4_;
      auVar138._4_4_ = auVar138._0_4_;
      auVar138._8_4_ = auVar138._0_4_;
      auVar138._12_4_ = auVar138._0_4_;
      auVar95 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar4,auVar138);
      auVar14 = vsubps_avx(local_570,auVar10);
      auVar10 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar204._0_4_ = fVar110 * auVar10._0_4_;
      auVar204._4_4_ = fVar112 * auVar10._4_4_;
      auVar204._8_4_ = fVar135 * auVar10._8_4_;
      auVar204._12_4_ = fVar111 * auVar10._12_4_;
      auVar10 = vshufps_avx(auVar14,auVar14,0x55);
      auVar10 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar5,auVar10);
      auVar12 = vblendps_avx(auVar95,local_630,8);
      auVar97._0_4_ = auVar14._0_4_;
      auVar97._4_4_ = auVar97._0_4_;
      auVar97._8_4_ = auVar97._0_4_;
      auVar97._12_4_ = auVar97._0_4_;
      auVar136 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar4,auVar97);
      auVar14 = vinsertps_avx(auVar136,auVar212,0x30);
      auVar10 = vandps_avx(auVar13,local_450);
      auVar11 = vandps_avx(auVar11,local_450);
      auVar13 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar12,local_450);
      auVar11 = vandps_avx(auVar14,local_450);
      auVar10 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vmaxps_avx(auVar13,auVar10);
      auVar11 = vmovshdup_avx(auVar10);
      auVar11 = vmaxss_avx(auVar11,auVar10);
      auVar10 = vshufpd_avx(auVar10,auVar10,1);
      auVar10 = vmaxss_avx(auVar10,auVar11);
      auVar11 = vmovshdup_avx(auVar15);
      uVar92 = auVar11._0_8_;
      local_5a0._8_8_ = uVar92;
      local_5a0._0_8_ = uVar92;
      local_5a0._16_8_ = uVar92;
      local_5a0._24_8_ = uVar92;
      auVar11 = vmovshdup_avx(auVar96);
      local_940 = auVar96._0_4_;
      uVar92 = auVar11._0_8_;
      local_760._8_8_ = uVar92;
      local_760._0_8_ = uVar92;
      local_760._16_8_ = uVar92;
      local_760._24_8_ = uVar92;
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar16 + 0x908);
      auVar11 = vmovshdup_avx(auVar95);
      uVar92 = auVar11._0_8_;
      auVar199._8_8_ = uVar92;
      auVar199._0_8_ = uVar92;
      auVar199._16_8_ = uVar92;
      auVar199._24_8_ = uVar92;
      auVar12 = vmovshdup_avx(auVar136);
      uVar92 = auVar12._0_8_;
      uVar118 = auVar95._0_4_;
      auVar124._4_4_ = uVar118;
      auVar124._0_4_ = uVar118;
      auVar124._8_4_ = uVar118;
      auVar124._12_4_ = uVar118;
      auVar124._16_4_ = uVar118;
      auVar124._20_4_ = uVar118;
      auVar124._24_4_ = uVar118;
      auVar124._28_4_ = uVar118;
      pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar16 + 0xd8c);
      fVar135 = *(float *)*pauVar1;
      fVar111 = *(float *)(bezier_basis0 + lVar16 + 0xd90);
      fVar113 = *(float *)(bezier_basis0 + lVar16 + 0xd94);
      fVar114 = *(float *)(bezier_basis0 + lVar16 + 0xd98);
      fVar115 = *(float *)(bezier_basis0 + lVar16 + 0xd9c);
      fVar116 = *(float *)(bezier_basis0 + lVar16 + 0xda0);
      fVar117 = *(float *)(bezier_basis0 + lVar16 + 0xda4);
      auVar78 = *(undefined1 (*) [28])*pauVar1;
      fVar202 = auVar136._0_4_;
      auVar152._0_4_ = fVar135 * fVar202;
      auVar152._4_4_ = fVar111 * fVar202;
      auVar152._8_4_ = fVar113 * fVar202;
      auVar152._12_4_ = fVar114 * fVar202;
      auVar152._16_4_ = fVar115 * fVar202;
      auVar152._20_4_ = fVar116 * fVar202;
      auVar152._24_4_ = fVar117 * fVar202;
      auVar152._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar152,auVar99,auVar124);
      fVar110 = auVar12._0_4_;
      auVar109._0_4_ = fVar135 * fVar110;
      fVar112 = auVar12._4_4_;
      auVar109._4_4_ = fVar111 * fVar112;
      auVar109._8_4_ = fVar113 * fVar110;
      auVar109._12_4_ = fVar114 * fVar112;
      auVar109._16_4_ = fVar115 * fVar110;
      auVar109._20_4_ = fVar116 * fVar112;
      auVar109._24_4_ = fVar117 * fVar110;
      auVar109._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar109,auVar99,auVar199);
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar16 + 0x484);
      auVar173._4_4_ = local_940;
      auVar173._0_4_ = local_940;
      auVar173._8_4_ = local_940;
      auVar173._12_4_ = local_940;
      auVar173._16_4_ = local_940;
      auVar173._20_4_ = local_940;
      auVar173._24_4_ = local_940;
      auVar173._28_4_ = local_940;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar109,auVar173);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar109,local_760);
      auVar152 = *(undefined1 (*) [32])(bezier_basis0 + lVar16);
      uVar180 = auVar15._0_4_;
      auVar167._4_4_ = uVar180;
      auVar167._0_4_ = uVar180;
      auVar167._8_4_ = uVar180;
      auVar167._12_4_ = uVar180;
      auVar167._16_4_ = uVar180;
      auVar167._20_4_ = uVar180;
      auVar167._24_4_ = uVar180;
      auVar167._28_4_ = uVar180;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar152,auVar167);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar152,local_5a0);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar16 + 0x908);
      fVar66 = *(float *)(bezier_basis1 + lVar16 + 0xd8c);
      fVar67 = *(float *)(bezier_basis1 + lVar16 + 0xd90);
      fVar68 = *(float *)(bezier_basis1 + lVar16 + 0xd94);
      fVar69 = *(float *)(bezier_basis1 + lVar16 + 0xd98);
      fVar70 = *(float *)(bezier_basis1 + lVar16 + 0xd9c);
      fVar71 = *(float *)(bezier_basis1 + lVar16 + 0xda0);
      fVar72 = *(float *)(bezier_basis1 + lVar16 + 0xda4);
      auVar130._4_4_ = fVar67 * fVar202;
      auVar130._0_4_ = fVar66 * fVar202;
      auVar130._8_4_ = fVar68 * fVar202;
      auVar130._12_4_ = fVar69 * fVar202;
      auVar130._16_4_ = fVar70 * fVar202;
      auVar130._20_4_ = fVar71 * fVar202;
      auVar130._24_4_ = fVar72 * fVar202;
      auVar130._28_4_ = fVar202;
      auVar14 = vfmadd231ps_fma(auVar130,auVar107,auVar124);
      auVar6._4_4_ = fVar67 * fVar112;
      auVar6._0_4_ = fVar66 * fVar110;
      auVar6._8_4_ = fVar68 * fVar110;
      auVar6._12_4_ = fVar69 * fVar112;
      auVar6._16_4_ = fVar70 * fVar110;
      auVar6._20_4_ = fVar71 * fVar112;
      auVar6._24_4_ = fVar72 * fVar110;
      auVar6._28_4_ = uVar118;
      auVar121 = vfmadd231ps_fma(auVar6,auVar107,auVar199);
      auVar130 = *(undefined1 (*) [32])(bezier_basis1 + lVar16 + 0x484);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar130,auVar173);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar130,local_760);
      auVar6 = *(undefined1 (*) [32])(bezier_basis1 + lVar16);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar6,auVar167);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar6,local_5a0);
      auVar100 = ZEXT1632(auVar14);
      auVar153 = ZEXT1632(auVar13);
      auVar132 = vsubps_avx(auVar100,auVar153);
      auVar125 = ZEXT1632(auVar121);
      auVar143 = ZEXT1632(auVar12);
      auVar146 = vsubps_avx(auVar125,auVar143);
      auVar101._0_4_ = auVar12._0_4_ * auVar132._0_4_;
      auVar101._4_4_ = auVar12._4_4_ * auVar132._4_4_;
      auVar101._8_4_ = auVar12._8_4_ * auVar132._8_4_;
      auVar101._12_4_ = auVar12._12_4_ * auVar132._12_4_;
      auVar101._16_4_ = auVar132._16_4_ * 0.0;
      auVar101._20_4_ = auVar132._20_4_ * 0.0;
      auVar101._24_4_ = auVar132._24_4_ * 0.0;
      auVar101._28_4_ = 0;
      fVar203 = auVar146._0_4_;
      auVar126._0_4_ = fVar203 * auVar13._0_4_;
      fVar209 = auVar146._4_4_;
      auVar126._4_4_ = fVar209 * auVar13._4_4_;
      fVar214 = auVar146._8_4_;
      auVar126._8_4_ = fVar214 * auVar13._8_4_;
      fVar215 = auVar146._12_4_;
      auVar126._12_4_ = fVar215 * auVar13._12_4_;
      fVar216 = auVar146._16_4_;
      auVar126._16_4_ = fVar216 * 0.0;
      fVar217 = auVar146._20_4_;
      auVar126._20_4_ = fVar217 * 0.0;
      fVar218 = auVar146._24_4_;
      auVar126._24_4_ = fVar218 * 0.0;
      auVar126._28_4_ = 0;
      auVar101 = vsubps_avx(auVar101,auVar126);
      auVar12 = vpermilps_avx(local_620,0xff);
      uVar119 = auVar12._0_8_;
      local_80._8_8_ = uVar119;
      local_80._0_8_ = uVar119;
      local_80._16_8_ = uVar119;
      local_80._24_8_ = uVar119;
      auVar13 = vpermilps_avx(local_630,0xff);
      local_a0._0_8_ = auVar13._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      auVar190._4_4_ = fVar111 * fVar134;
      auVar190._0_4_ = fVar135 * fVar134;
      auVar190._8_4_ = fVar113 * fVar134;
      auVar190._12_4_ = fVar114 * fVar134;
      auVar190._16_4_ = fVar115 * fVar134;
      auVar190._20_4_ = fVar116 * fVar134;
      auVar190._24_4_ = fVar117 * fVar134;
      auVar190._28_4_ = *(undefined4 *)(bezier_basis0 + lVar16 + 0xda8);
      auVar13 = vfmadd231ps_fma(auVar190,local_a0,auVar99);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar109,local_80);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar152,local_2a0);
      auVar108._4_4_ = fVar67 * fVar134;
      auVar108._0_4_ = fVar66 * fVar134;
      auVar108._8_4_ = fVar68 * fVar134;
      auVar108._12_4_ = fVar69 * fVar134;
      auVar108._16_4_ = fVar70 * fVar134;
      auVar108._20_4_ = fVar71 * fVar134;
      auVar108._24_4_ = fVar72 * fVar134;
      auVar108._28_4_ = auVar152._28_4_;
      auVar14 = vfmadd231ps_fma(auVar108,auVar107,local_a0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar130,local_80);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar6,local_2a0);
      auVar184._4_4_ = fVar209 * fVar209;
      auVar184._0_4_ = fVar203 * fVar203;
      auVar184._8_4_ = fVar214 * fVar214;
      auVar184._12_4_ = fVar215 * fVar215;
      auVar184._16_4_ = fVar216 * fVar216;
      auVar184._20_4_ = fVar217 * fVar217;
      auVar184._24_4_ = fVar218 * fVar218;
      auVar184._28_4_ = auVar12._4_4_;
      auVar12 = vfmadd231ps_fma(auVar184,auVar132,auVar132);
      auVar190 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar196._4_4_ = auVar190._4_4_ * auVar190._4_4_ * auVar12._4_4_;
      auVar196._0_4_ = auVar190._0_4_ * auVar190._0_4_ * auVar12._0_4_;
      auVar196._8_4_ = auVar190._8_4_ * auVar190._8_4_ * auVar12._8_4_;
      auVar196._12_4_ = auVar190._12_4_ * auVar190._12_4_ * auVar12._12_4_;
      auVar196._16_4_ = auVar190._16_4_ * auVar190._16_4_ * 0.0;
      auVar196._20_4_ = auVar190._20_4_ * auVar190._20_4_ * 0.0;
      auVar196._24_4_ = auVar190._24_4_ * auVar190._24_4_ * 0.0;
      auVar196._28_4_ = auVar190._28_4_;
      auVar205._4_4_ = auVar101._4_4_ * auVar101._4_4_;
      auVar205._0_4_ = auVar101._0_4_ * auVar101._0_4_;
      auVar205._8_4_ = auVar101._8_4_ * auVar101._8_4_;
      auVar205._12_4_ = auVar101._12_4_ * auVar101._12_4_;
      auVar205._16_4_ = auVar101._16_4_ * auVar101._16_4_;
      auVar205._20_4_ = auVar101._20_4_ * auVar101._20_4_;
      auVar205._24_4_ = auVar101._24_4_ * auVar101._24_4_;
      auVar205._28_4_ = 0;
      auVar190 = vcmpps_avx(auVar205,auVar196,2);
      fVar134 = auVar10._0_4_ * 4.7683716e-07;
      local_540._0_4_ = (undefined4)iVar83;
      register0x00001204 = auVar136._4_12_;
      auVar102._4_4_ = local_540._0_4_;
      auVar102._0_4_ = local_540._0_4_;
      auVar102._8_4_ = local_540._0_4_;
      auVar102._12_4_ = local_540._0_4_;
      auVar102._16_4_ = local_540._0_4_;
      auVar102._20_4_ = local_540._0_4_;
      auVar102._24_4_ = local_540._0_4_;
      auVar102._28_4_ = local_540._0_4_;
      auVar101 = vcmpps_avx(_DAT_02020f40,auVar102,1);
      auVar12 = vpermilps_avx(auVar15,0xaa);
      uVar119 = auVar12._0_8_;
      auVar168._8_8_ = uVar119;
      auVar168._0_8_ = uVar119;
      auVar168._16_8_ = uVar119;
      auVar168._24_8_ = uVar119;
      auVar10 = vpermilps_avx(auVar96,0xaa);
      uVar119 = auVar10._0_8_;
      local_520._8_8_ = uVar119;
      local_520._0_8_ = uVar119;
      local_520._16_8_ = uVar119;
      local_520._24_8_ = uVar119;
      auVar10 = vpermilps_avx(auVar95,0xaa);
      uVar119 = auVar10._0_8_;
      local_480._8_8_ = uVar119;
      local_480._0_8_ = uVar119;
      local_480._16_8_ = uVar119;
      local_480._24_8_ = uVar119;
      auVar10 = vshufps_avx(auVar136,auVar136,0xaa);
      uVar119 = auVar10._0_8_;
      register0x00001508 = uVar119;
      local_720 = uVar119;
      register0x00001510 = uVar119;
      register0x00001518 = uVar119;
      auVar207 = ZEXT3264(_local_720);
      auVar108 = auVar101 & auVar190;
      uVar118 = *(undefined4 *)(ray + k * 4 + 0x60);
      if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0x7f,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0xbf,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar108[0x1f]) {
        bVar91 = false;
        auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,CONCAT416(fVar110,
                                                  CONCAT412(fVar112,CONCAT48(fVar110,uVar92)))))));
        auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(fVar202,
                                                  CONCAT412(fVar202,CONCAT48(fVar202,CONCAT44(
                                                  fVar202,fVar202))))))));
        auVar99 = local_6a0;
        auVar109 = local_680;
      }
      else {
        local_4c0 = vandps_avx(auVar190,auVar101);
        fVar203 = auVar10._0_4_;
        fVar209 = auVar10._4_4_;
        auVar17._4_4_ = fVar209 * fVar67;
        auVar17._0_4_ = fVar203 * fVar66;
        auVar17._8_4_ = fVar203 * fVar68;
        auVar17._12_4_ = fVar209 * fVar69;
        auVar17._16_4_ = fVar203 * fVar70;
        auVar17._20_4_ = fVar209 * fVar71;
        auVar17._24_4_ = fVar203 * fVar72;
        auVar17._28_4_ = local_4c0._28_4_;
        auVar10 = vfmadd213ps_fma(auVar107,local_480,auVar17);
        auVar10 = vfmadd213ps_fma(auVar130,local_520,ZEXT1632(auVar10));
        auVar10 = vfmadd213ps_fma(auVar6,auVar168,ZEXT1632(auVar10));
        local_4a0._0_4_ = auVar78._0_4_;
        local_4a0._4_4_ = auVar78._4_4_;
        fStack_498 = auVar78._8_4_;
        fStack_494 = auVar78._12_4_;
        fStack_490 = auVar78._16_4_;
        fStack_48c = auVar78._20_4_;
        fStack_488 = auVar78._24_4_;
        auVar103._0_4_ = fVar203 * (float)local_4a0._0_4_;
        auVar103._4_4_ = fVar209 * (float)local_4a0._4_4_;
        auVar103._8_4_ = fVar203 * fStack_498;
        auVar103._12_4_ = fVar209 * fStack_494;
        auVar103._16_4_ = fVar203 * fStack_490;
        auVar103._20_4_ = fVar209 * fStack_48c;
        auVar103._24_4_ = fVar203 * fStack_488;
        auVar103._28_4_ = 0;
        auVar15 = vfmadd213ps_fma(auVar99,local_480,auVar103);
        auVar15 = vfmadd213ps_fma(auVar109,local_520,ZEXT1632(auVar15));
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar16 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar16 + 0x1694);
        auVar130 = *(undefined1 (*) [32])(bezier_basis0 + lVar16 + 0x1b18);
        fVar135 = *(float *)(bezier_basis0 + lVar16 + 0x1f9c);
        fVar111 = *(float *)(bezier_basis0 + lVar16 + 0x1fa0);
        fVar113 = *(float *)(bezier_basis0 + lVar16 + 0x1fa4);
        fVar114 = *(float *)(bezier_basis0 + lVar16 + 0x1fa8);
        fVar115 = *(float *)(bezier_basis0 + lVar16 + 0x1fac);
        fVar116 = *(float *)(bezier_basis0 + lVar16 + 0x1fb0);
        fVar117 = *(float *)(bezier_basis0 + lVar16 + 0x1fb4);
        auVar18._4_4_ = fVar202 * fVar111;
        auVar18._0_4_ = fVar202 * fVar135;
        auVar18._8_4_ = fVar202 * fVar113;
        auVar18._12_4_ = fVar202 * fVar114;
        auVar18._16_4_ = fVar202 * fVar115;
        auVar18._20_4_ = fVar202 * fVar116;
        auVar18._24_4_ = fVar202 * fVar117;
        auVar18._28_4_ = auVar12._4_4_;
        auVar19._4_4_ = fVar111 * fVar112;
        auVar19._0_4_ = fVar135 * fVar110;
        auVar19._8_4_ = fVar113 * fVar110;
        auVar19._12_4_ = fVar114 * fVar112;
        auVar19._16_4_ = fVar115 * fVar110;
        auVar19._20_4_ = fVar116 * fVar112;
        auVar19._24_4_ = fVar117 * fVar110;
        auVar19._28_4_ = auVar107._28_4_;
        auVar107._4_4_ = fVar209 * fVar111;
        auVar107._0_4_ = fVar203 * fVar135;
        auVar107._8_4_ = fVar203 * fVar113;
        auVar107._12_4_ = fVar209 * fVar114;
        auVar107._16_4_ = fVar203 * fVar115;
        auVar107._20_4_ = fVar209 * fVar116;
        auVar107._24_4_ = fVar203 * fVar117;
        auVar107._28_4_ = *(undefined4 *)(bezier_basis1 + lVar16 + 0xda8);
        auVar12 = vfmadd231ps_fma(auVar18,auVar130,auVar124);
        auVar96 = vfmadd231ps_fma(auVar19,auVar130,auVar199);
        auVar95 = vfmadd231ps_fma(auVar107,local_480,auVar130);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar109,auVar173);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar109,local_760);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_520,auVar109);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar99,auVar167);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar99,local_5a0);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar99,auVar168);
        fVar135 = *(float *)(bezier_basis1 + lVar16 + 0x1f9c);
        fVar111 = *(float *)(bezier_basis1 + lVar16 + 0x1fa0);
        fVar113 = *(float *)(bezier_basis1 + lVar16 + 0x1fa4);
        fVar114 = *(float *)(bezier_basis1 + lVar16 + 0x1fa8);
        fVar115 = *(float *)(bezier_basis1 + lVar16 + 0x1fac);
        fVar116 = *(float *)(bezier_basis1 + lVar16 + 0x1fb0);
        fVar117 = *(float *)(bezier_basis1 + lVar16 + 0x1fb4);
        auVar20._4_4_ = fVar202 * fVar111;
        auVar20._0_4_ = fVar202 * fVar135;
        auVar20._8_4_ = fVar202 * fVar113;
        auVar20._12_4_ = fVar202 * fVar114;
        auVar20._16_4_ = fVar202 * fVar115;
        auVar20._20_4_ = fVar202 * fVar116;
        auVar20._24_4_ = fVar202 * fVar117;
        auVar20._28_4_ = fVar209;
        auVar21._4_4_ = fVar112 * fVar111;
        auVar21._0_4_ = fVar110 * fVar135;
        auVar21._8_4_ = fVar110 * fVar113;
        auVar21._12_4_ = fVar112 * fVar114;
        auVar21._16_4_ = fVar110 * fVar115;
        auVar21._20_4_ = fVar112 * fVar116;
        auVar21._24_4_ = fVar110 * fVar117;
        auVar21._28_4_ = fVar202;
        auVar22._4_4_ = fVar209 * fVar111;
        auVar22._0_4_ = fVar203 * fVar135;
        auVar22._8_4_ = fVar203 * fVar113;
        auVar22._12_4_ = fVar209 * fVar114;
        auVar22._16_4_ = fVar203 * fVar115;
        auVar22._20_4_ = fVar209 * fVar116;
        auVar22._24_4_ = fVar203 * fVar117;
        auVar22._28_4_ = fVar209;
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar16 + 0x1b18);
        auVar136 = vfmadd231ps_fma(auVar20,auVar99,auVar124);
        auVar121 = vfmadd231ps_fma(auVar21,auVar99,auVar199);
        auVar94 = vfmadd231ps_fma(auVar22,local_480,auVar99);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar16 + 0x1694);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar99,auVar173);
        auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar99,local_760);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_520,auVar99);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar16 + 0x1210);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar99,auVar167);
        auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar99,local_5a0);
        auVar127._8_4_ = 0x7fffffff;
        auVar127._0_8_ = 0x7fffffff7fffffff;
        auVar127._12_4_ = 0x7fffffff;
        auVar127._16_4_ = 0x7fffffff;
        auVar127._20_4_ = 0x7fffffff;
        auVar127._24_4_ = 0x7fffffff;
        auVar127._28_4_ = 0x7fffffff;
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar168,auVar99);
        auVar99 = vandps_avx(ZEXT1632(auVar12),auVar127);
        auVar109 = vandps_avx(ZEXT1632(auVar96),auVar127);
        auVar109 = vmaxps_avx(auVar99,auVar109);
        auVar99 = vandps_avx(ZEXT1632(auVar95),auVar127);
        auVar99 = vmaxps_avx(auVar109,auVar99);
        auVar144._4_4_ = fVar134;
        auVar144._0_4_ = fVar134;
        auVar144._8_4_ = fVar134;
        auVar144._12_4_ = fVar134;
        auVar144._16_4_ = fVar134;
        auVar144._20_4_ = fVar134;
        auVar144._24_4_ = fVar134;
        auVar144._28_4_ = fVar134;
        auVar99 = vcmpps_avx(auVar99,auVar144,1);
        auVar107 = vblendvps_avx(ZEXT1632(auVar12),auVar132,auVar99);
        auVar130 = vblendvps_avx(ZEXT1632(auVar96),auVar146,auVar99);
        auVar99 = vandps_avx(ZEXT1632(auVar136),auVar127);
        auVar109 = vandps_avx(ZEXT1632(auVar121),auVar127);
        auVar109 = vmaxps_avx(auVar99,auVar109);
        auVar99 = vandps_avx(ZEXT1632(auVar94),auVar127);
        auVar99 = vmaxps_avx(auVar109,auVar99);
        auVar6 = vcmpps_avx(auVar99,auVar144,1);
        auVar99 = vblendvps_avx(ZEXT1632(auVar136),auVar132,auVar6);
        auVar109 = vblendvps_avx(ZEXT1632(auVar121),auVar146,auVar6);
        auVar12 = vfmadd213ps_fma(auVar152,auVar168,ZEXT1632(auVar15));
        auVar15 = vfmadd213ps_fma(auVar107,auVar107,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar130,auVar130);
        auVar152 = vrsqrtps_avx(ZEXT1632(auVar15));
        fVar135 = auVar152._0_4_;
        fVar111 = auVar152._4_4_;
        fVar113 = auVar152._8_4_;
        fVar114 = auVar152._12_4_;
        fVar115 = auVar152._16_4_;
        fVar116 = auVar152._20_4_;
        fVar117 = auVar152._24_4_;
        auVar132._4_4_ = fVar111 * fVar111 * fVar111 * auVar15._4_4_ * -0.5;
        auVar132._0_4_ = fVar135 * fVar135 * fVar135 * auVar15._0_4_ * -0.5;
        auVar132._8_4_ = fVar113 * fVar113 * fVar113 * auVar15._8_4_ * -0.5;
        auVar132._12_4_ = fVar114 * fVar114 * fVar114 * auVar15._12_4_ * -0.5;
        auVar132._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar132._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar132._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar132._28_4_ = 0;
        auVar200._8_4_ = 0x3fc00000;
        auVar200._0_8_ = 0x3fc000003fc00000;
        auVar200._12_4_ = 0x3fc00000;
        auVar200._16_4_ = 0x3fc00000;
        auVar200._20_4_ = 0x3fc00000;
        auVar200._24_4_ = 0x3fc00000;
        auVar200._28_4_ = 0x3fc00000;
        auVar15 = vfmadd231ps_fma(auVar132,auVar200,auVar152);
        fVar135 = auVar15._0_4_;
        fVar111 = auVar15._4_4_;
        auVar23._4_4_ = auVar130._4_4_ * fVar111;
        auVar23._0_4_ = auVar130._0_4_ * fVar135;
        fVar113 = auVar15._8_4_;
        auVar23._8_4_ = auVar130._8_4_ * fVar113;
        fVar114 = auVar15._12_4_;
        auVar23._12_4_ = auVar130._12_4_ * fVar114;
        auVar23._16_4_ = auVar130._16_4_ * 0.0;
        auVar23._20_4_ = auVar130._20_4_ * 0.0;
        auVar23._24_4_ = auVar130._24_4_ * 0.0;
        auVar23._28_4_ = auVar152._28_4_;
        auVar24._4_4_ = -auVar107._4_4_ * fVar111;
        auVar24._0_4_ = -auVar107._0_4_ * fVar135;
        auVar24._8_4_ = -auVar107._8_4_ * fVar113;
        auVar24._12_4_ = -auVar107._12_4_ * fVar114;
        auVar24._16_4_ = -auVar107._16_4_ * 0.0;
        auVar24._20_4_ = -auVar107._20_4_ * 0.0;
        auVar24._24_4_ = -auVar107._24_4_ * 0.0;
        auVar24._28_4_ = 0x80000000;
        auVar15 = vfmadd213ps_fma(auVar99,auVar99,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar109,auVar109);
        auVar152 = vrsqrtps_avx(ZEXT1632(auVar15));
        auVar25._28_4_ = auVar6._28_4_;
        auVar25._0_28_ =
             ZEXT1628(CONCAT412(fVar114 * 0.0,
                                CONCAT48(fVar113 * 0.0,CONCAT44(fVar111 * 0.0,fVar135 * 0.0))));
        fVar135 = auVar152._0_4_;
        fVar111 = auVar152._4_4_;
        fVar113 = auVar152._8_4_;
        fVar114 = auVar152._12_4_;
        fVar115 = auVar152._16_4_;
        fVar116 = auVar152._20_4_;
        fVar117 = auVar152._24_4_;
        auVar26._4_4_ = fVar111 * fVar111 * fVar111 * auVar15._4_4_ * -0.5;
        auVar26._0_4_ = fVar135 * fVar135 * fVar135 * auVar15._0_4_ * -0.5;
        auVar26._8_4_ = fVar113 * fVar113 * fVar113 * auVar15._8_4_ * -0.5;
        auVar26._12_4_ = fVar114 * fVar114 * fVar114 * auVar15._12_4_ * -0.5;
        auVar26._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar26._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar26._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar26._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar26,auVar200,auVar152);
        fVar135 = auVar15._0_4_;
        fVar111 = auVar15._4_4_;
        auVar27._4_4_ = auVar109._4_4_ * fVar111;
        auVar27._0_4_ = auVar109._0_4_ * fVar135;
        fVar113 = auVar15._8_4_;
        auVar27._8_4_ = auVar109._8_4_ * fVar113;
        fVar114 = auVar15._12_4_;
        auVar27._12_4_ = auVar109._12_4_ * fVar114;
        auVar27._16_4_ = auVar109._16_4_ * 0.0;
        auVar27._20_4_ = auVar109._20_4_ * 0.0;
        auVar27._24_4_ = auVar109._24_4_ * 0.0;
        auVar27._28_4_ = auVar109._28_4_;
        auVar28._4_4_ = fVar111 * -auVar99._4_4_;
        auVar28._0_4_ = fVar135 * -auVar99._0_4_;
        auVar28._8_4_ = fVar113 * -auVar99._8_4_;
        auVar28._12_4_ = fVar114 * -auVar99._12_4_;
        auVar28._16_4_ = -auVar99._16_4_ * 0.0;
        auVar28._20_4_ = -auVar99._20_4_ * 0.0;
        auVar28._24_4_ = -auVar99._24_4_ * 0.0;
        auVar28._28_4_ = auVar107._28_4_ ^ 0x80000000;
        auVar29._28_4_ = auVar152._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar114 * 0.0,
                                CONCAT48(fVar113 * 0.0,CONCAT44(fVar111 * 0.0,fVar135 * 0.0))));
        auVar15 = vfmadd213ps_fma(auVar23,ZEXT1632(auVar13),auVar153);
        auVar126 = ZEXT1632(auVar13);
        auVar13 = vfmadd213ps_fma(auVar24,auVar126,auVar143);
        local_7a0 = ZEXT1632(auVar13);
        auVar13 = vfmadd213ps_fma(auVar25,auVar126,ZEXT1632(auVar12));
        auVar121 = vfnmadd213ps_fma(auVar23,auVar126,auVar153);
        auVar96 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar14),auVar100);
        auVar94 = vfnmadd213ps_fma(auVar24,auVar126,auVar143);
        auVar99 = ZEXT1632(auVar14);
        auVar95 = vfmadd213ps_fma(auVar28,auVar99,auVar125);
        auVar158 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar126,auVar25);
        auVar12 = vfmadd213ps_fma(auVar29,auVar99,ZEXT1632(auVar10));
        auVar122 = vfnmadd213ps_fma(auVar27,auVar99,auVar100);
        auVar150 = vfnmadd213ps_fma(auVar28,auVar99,auVar125);
        auVar93 = vfnmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar14),auVar29);
        auVar99 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar94));
        auVar109 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar158));
        auVar100._4_4_ = auVar158._4_4_ * auVar99._4_4_;
        auVar100._0_4_ = auVar158._0_4_ * auVar99._0_4_;
        auVar100._8_4_ = auVar158._8_4_ * auVar99._8_4_;
        auVar100._12_4_ = auVar158._12_4_ * auVar99._12_4_;
        auVar100._16_4_ = auVar99._16_4_ * 0.0;
        auVar100._20_4_ = auVar99._20_4_ * 0.0;
        auVar100._24_4_ = auVar99._24_4_ * 0.0;
        auVar100._28_4_ = 0;
        auVar136 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar94),auVar109);
        auVar125._4_4_ = auVar121._4_4_ * auVar109._4_4_;
        auVar125._0_4_ = auVar121._0_4_ * auVar109._0_4_;
        auVar125._8_4_ = auVar121._8_4_ * auVar109._8_4_;
        auVar125._12_4_ = auVar121._12_4_ * auVar109._12_4_;
        auVar125._16_4_ = auVar109._16_4_ * 0.0;
        auVar125._20_4_ = auVar109._20_4_ * 0.0;
        auVar125._24_4_ = auVar109._24_4_ * 0.0;
        auVar125._28_4_ = auVar109._28_4_;
        auVar190 = ZEXT1632(auVar121);
        auVar109 = vsubps_avx(ZEXT1632(auVar96),auVar190);
        auVar10 = vfmsub231ps_fma(auVar125,ZEXT1632(auVar158),auVar109);
        auVar143._4_4_ = auVar94._4_4_ * auVar109._4_4_;
        auVar143._0_4_ = auVar94._0_4_ * auVar109._0_4_;
        auVar143._8_4_ = auVar94._8_4_ * auVar109._8_4_;
        auVar143._12_4_ = auVar94._12_4_ * auVar109._12_4_;
        auVar143._16_4_ = auVar109._16_4_ * 0.0;
        auVar143._20_4_ = auVar109._20_4_ * 0.0;
        auVar143._24_4_ = auVar109._24_4_ * 0.0;
        auVar143._28_4_ = auVar109._28_4_;
        auVar121 = vfmsub231ps_fma(auVar143,auVar190,auVar99);
        auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar99,ZEXT1632(auVar10));
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar99,ZEXT1632(auVar136));
        auVar108 = vcmpps_avx(ZEXT1632(auVar10),ZEXT1232(ZEXT812(0)) << 0x20,2);
        auVar99 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar15),auVar108);
        auVar109 = vblendvps_avx(ZEXT1632(auVar150),local_7a0,auVar108);
        auVar152 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar13),auVar108);
        auVar107 = vblendvps_avx(auVar190,ZEXT1632(auVar96),auVar108);
        auVar130 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar95),auVar108);
        auVar6 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar12),auVar108);
        auVar190 = vblendvps_avx(ZEXT1632(auVar96),auVar190,auVar108);
        auVar101 = vblendvps_avx(ZEXT1632(auVar95),ZEXT1632(auVar94),auVar108);
        auVar10 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar132 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar158),auVar108);
        auVar184 = vsubps_avx(auVar190,auVar99);
        auVar101 = vsubps_avx(auVar101,auVar109);
        auVar196 = vsubps_avx(auVar132,auVar152);
        auVar205 = vsubps_avx(auVar99,auVar107);
        auVar100 = vsubps_avx(auVar109,auVar130);
        auVar102 = vsubps_avx(auVar152,auVar6);
        auVar153._4_4_ = auVar196._4_4_ * auVar99._4_4_;
        auVar153._0_4_ = auVar196._0_4_ * auVar99._0_4_;
        auVar153._8_4_ = auVar196._8_4_ * auVar99._8_4_;
        auVar153._12_4_ = auVar196._12_4_ * auVar99._12_4_;
        auVar153._16_4_ = auVar196._16_4_ * auVar99._16_4_;
        auVar153._20_4_ = auVar196._20_4_ * auVar99._20_4_;
        auVar153._24_4_ = auVar196._24_4_ * auVar99._24_4_;
        auVar153._28_4_ = auVar132._28_4_;
        auVar12 = vfmsub231ps_fma(auVar153,auVar152,auVar184);
        auVar30._4_4_ = auVar184._4_4_ * auVar109._4_4_;
        auVar30._0_4_ = auVar184._0_4_ * auVar109._0_4_;
        auVar30._8_4_ = auVar184._8_4_ * auVar109._8_4_;
        auVar30._12_4_ = auVar184._12_4_ * auVar109._12_4_;
        auVar30._16_4_ = auVar184._16_4_ * auVar109._16_4_;
        auVar30._20_4_ = auVar184._20_4_ * auVar109._20_4_;
        auVar30._24_4_ = auVar184._24_4_ * auVar109._24_4_;
        auVar30._28_4_ = auVar190._28_4_;
        auVar13 = vfmsub231ps_fma(auVar30,auVar99,auVar101);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar104._0_4_ = auVar101._0_4_ * auVar152._0_4_;
        auVar104._4_4_ = auVar101._4_4_ * auVar152._4_4_;
        auVar104._8_4_ = auVar101._8_4_ * auVar152._8_4_;
        auVar104._12_4_ = auVar101._12_4_ * auVar152._12_4_;
        auVar104._16_4_ = auVar101._16_4_ * auVar152._16_4_;
        auVar104._20_4_ = auVar101._20_4_ * auVar152._20_4_;
        auVar104._24_4_ = auVar101._24_4_ * auVar152._24_4_;
        auVar104._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar104,auVar109,auVar196);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar105._0_4_ = auVar102._0_4_ * auVar107._0_4_;
        auVar105._4_4_ = auVar102._4_4_ * auVar107._4_4_;
        auVar105._8_4_ = auVar102._8_4_ * auVar107._8_4_;
        auVar105._12_4_ = auVar102._12_4_ * auVar107._12_4_;
        auVar105._16_4_ = auVar102._16_4_ * auVar107._16_4_;
        auVar105._20_4_ = auVar102._20_4_ * auVar107._20_4_;
        auVar105._24_4_ = auVar102._24_4_ * auVar107._24_4_;
        auVar105._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar105,auVar205,auVar6);
        auVar31._4_4_ = auVar100._4_4_ * auVar6._4_4_;
        auVar31._0_4_ = auVar100._0_4_ * auVar6._0_4_;
        auVar31._8_4_ = auVar100._8_4_ * auVar6._8_4_;
        auVar31._12_4_ = auVar100._12_4_ * auVar6._12_4_;
        auVar31._16_4_ = auVar100._16_4_ * auVar6._16_4_;
        auVar31._20_4_ = auVar100._20_4_ * auVar6._20_4_;
        auVar31._24_4_ = auVar100._24_4_ * auVar6._24_4_;
        auVar31._28_4_ = auVar6._28_4_;
        auVar15 = vfmsub231ps_fma(auVar31,auVar130,auVar102);
        auVar32._4_4_ = auVar205._4_4_ * auVar130._4_4_;
        auVar32._0_4_ = auVar205._0_4_ * auVar130._0_4_;
        auVar32._8_4_ = auVar205._8_4_ * auVar130._8_4_;
        auVar32._12_4_ = auVar205._12_4_ * auVar130._12_4_;
        auVar32._16_4_ = auVar205._16_4_ * auVar130._16_4_;
        auVar32._20_4_ = auVar205._20_4_ * auVar130._20_4_;
        auVar32._24_4_ = auVar205._24_4_ * auVar130._24_4_;
        auVar32._28_4_ = auVar130._28_4_;
        auVar96 = vfmsub231ps_fma(auVar32,auVar100,auVar107);
        auVar130 = ZEXT832(0) << 0x20;
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar130,ZEXT1632(auVar12));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar130,ZEXT1632(auVar15));
        auVar107 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar15));
        auVar107 = vcmpps_avx(auVar107,ZEXT832(0) << 0x20,2);
        auVar12 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
        auVar10 = vpand_avx(auVar12,auVar10);
        auVar107 = vpmovsxwd_avx2(auVar10);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0x7f,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0xbf,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar107[0x1f]) {
LAB_016a5291:
          auVar176 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar156 = ZEXT3264(local_680);
          auVar197 = ZEXT3264(local_6a0);
        }
        else {
          auVar33._4_4_ = auVar101._4_4_ * auVar102._4_4_;
          auVar33._0_4_ = auVar101._0_4_ * auVar102._0_4_;
          auVar33._8_4_ = auVar101._8_4_ * auVar102._8_4_;
          auVar33._12_4_ = auVar101._12_4_ * auVar102._12_4_;
          auVar33._16_4_ = auVar101._16_4_ * auVar102._16_4_;
          auVar33._20_4_ = auVar101._20_4_ * auVar102._20_4_;
          auVar33._24_4_ = auVar101._24_4_ * auVar102._24_4_;
          auVar33._28_4_ = auVar107._28_4_;
          auVar136 = vfmsub231ps_fma(auVar33,auVar100,auVar196);
          auVar128._0_4_ = auVar205._0_4_ * auVar196._0_4_;
          auVar128._4_4_ = auVar205._4_4_ * auVar196._4_4_;
          auVar128._8_4_ = auVar205._8_4_ * auVar196._8_4_;
          auVar128._12_4_ = auVar205._12_4_ * auVar196._12_4_;
          auVar128._16_4_ = auVar205._16_4_ * auVar196._16_4_;
          auVar128._20_4_ = auVar205._20_4_ * auVar196._20_4_;
          auVar128._24_4_ = auVar205._24_4_ * auVar196._24_4_;
          auVar128._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar128,auVar184,auVar102);
          auVar34._4_4_ = auVar184._4_4_ * auVar100._4_4_;
          auVar34._0_4_ = auVar184._0_4_ * auVar100._0_4_;
          auVar34._8_4_ = auVar184._8_4_ * auVar100._8_4_;
          auVar34._12_4_ = auVar184._12_4_ * auVar100._12_4_;
          auVar34._16_4_ = auVar184._16_4_ * auVar100._16_4_;
          auVar34._20_4_ = auVar184._20_4_ * auVar100._20_4_;
          auVar34._24_4_ = auVar184._24_4_ * auVar100._24_4_;
          auVar34._28_4_ = auVar184._28_4_;
          auVar121 = vfmsub231ps_fma(auVar34,auVar205,auVar101);
          auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar121));
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar136),auVar130);
          auVar107 = vrcpps_avx(ZEXT1632(auVar96));
          auVar201._8_4_ = 0x3f800000;
          auVar201._0_8_ = &DAT_3f8000003f800000;
          auVar201._12_4_ = 0x3f800000;
          auVar201._16_4_ = 0x3f800000;
          auVar201._20_4_ = 0x3f800000;
          auVar201._24_4_ = 0x3f800000;
          auVar201._28_4_ = 0x3f800000;
          auVar12 = vfnmadd213ps_fma(auVar107,ZEXT1632(auVar96),auVar201);
          auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar107,auVar107);
          auVar169._0_4_ = auVar152._0_4_ * auVar121._0_4_;
          auVar169._4_4_ = auVar152._4_4_ * auVar121._4_4_;
          auVar169._8_4_ = auVar152._8_4_ * auVar121._8_4_;
          auVar169._12_4_ = auVar152._12_4_ * auVar121._12_4_;
          auVar169._16_4_ = auVar152._16_4_ * 0.0;
          auVar169._20_4_ = auVar152._20_4_ * 0.0;
          auVar169._24_4_ = auVar152._24_4_ * 0.0;
          auVar169._28_4_ = 0;
          auVar95 = vfmadd231ps_fma(auVar169,auVar109,ZEXT1632(auVar95));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar136),auVar99);
          fVar135 = auVar12._0_4_;
          fVar111 = auVar12._4_4_;
          fVar113 = auVar12._8_4_;
          fVar114 = auVar12._12_4_;
          auVar152 = ZEXT1632(CONCAT412(fVar114 * auVar95._12_4_,
                                        CONCAT48(fVar113 * auVar95._8_4_,
                                                 CONCAT44(fVar111 * auVar95._4_4_,
                                                          fVar135 * auVar95._0_4_))));
          auVar106._4_4_ = uVar118;
          auVar106._0_4_ = uVar118;
          auVar106._8_4_ = uVar118;
          auVar106._12_4_ = uVar118;
          auVar106._16_4_ = uVar118;
          auVar106._20_4_ = uVar118;
          auVar106._24_4_ = uVar118;
          auVar106._28_4_ = uVar118;
          uVar180 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar129._4_4_ = uVar180;
          auVar129._0_4_ = uVar180;
          auVar129._8_4_ = uVar180;
          auVar129._12_4_ = uVar180;
          auVar129._16_4_ = uVar180;
          auVar129._20_4_ = uVar180;
          auVar129._24_4_ = uVar180;
          auVar129._28_4_ = uVar180;
          auVar99 = vcmpps_avx(auVar106,auVar152,2);
          auVar109 = vcmpps_avx(auVar152,auVar129,2);
          auVar99 = vandps_avx(auVar109,auVar99);
          auVar12 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
          auVar10 = vpand_avx(auVar10,auVar12);
          auVar99 = vpmovsxwd_avx2(auVar10);
          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar99 >> 0x7f,0) == '\0') &&
                (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar99 >> 0xbf,0) == '\0') &&
              (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar99[0x1f]) goto LAB_016a5291;
          auVar99 = vcmpps_avx(auVar130,ZEXT1632(auVar96),4);
          auVar12 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
          auVar10 = vpand_avx(auVar10,auVar12);
          auVar99 = vpmovsxwd_avx2(auVar10);
          auVar176 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar156 = ZEXT3264(local_680);
          auVar197 = ZEXT3264(local_6a0);
          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar99 >> 0x7f,0) != '\0') ||
                (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar99 >> 0xbf,0) != '\0') ||
              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar99[0x1f] < '\0') {
            auVar107 = ZEXT1632(CONCAT412(fVar114 * auVar13._12_4_,
                                          CONCAT48(fVar113 * auVar13._8_4_,
                                                   CONCAT44(fVar111 * auVar13._4_4_,
                                                            fVar135 * auVar13._0_4_))));
            auVar130 = ZEXT1632(CONCAT412(fVar114 * auVar15._12_4_,
                                          CONCAT48(fVar113 * auVar15._8_4_,
                                                   CONCAT44(fVar111 * auVar15._4_4_,
                                                            fVar135 * auVar15._0_4_))));
            auVar161._8_4_ = 0x3f800000;
            auVar161._0_8_ = &DAT_3f8000003f800000;
            auVar161._12_4_ = 0x3f800000;
            auVar161._16_4_ = 0x3f800000;
            auVar161._20_4_ = 0x3f800000;
            auVar161._24_4_ = 0x3f800000;
            auVar161._28_4_ = 0x3f800000;
            auVar109 = vsubps_avx(auVar161,auVar107);
            auVar109 = vblendvps_avx(auVar109,auVar107,auVar108);
            auVar156 = ZEXT3264(auVar109);
            auVar109 = vsubps_avx(auVar161,auVar130);
            local_4e0 = vblendvps_avx(auVar109,auVar130,auVar108);
            auVar176 = ZEXT3264(auVar99);
            auVar197 = ZEXT3264(auVar152);
          }
        }
        auVar207 = ZEXT3264(_local_720);
        local_680 = auVar156._0_32_;
        auVar99 = auVar197._0_32_;
        auVar152 = auVar176._0_32_;
        auVar109 = local_680;
        if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar152 >> 0x7f,0) == '\0') &&
              (auVar176 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar152 >> 0xbf,0) == '\0') &&
            (auVar176 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar176[0x1f]) {
          bVar91 = false;
          auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,CONCAT416(
                                                  fVar110,CONCAT412(fVar112,CONCAT48(fVar110,uVar92)
                                                                   ))))));
          auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(
                                                  fVar202,CONCAT412(fVar202,CONCAT48(fVar202,
                                                  CONCAT44(fVar202,fVar202))))))));
        }
        else {
          auVar107 = vsubps_avx(ZEXT1632(auVar14),auVar126);
          auVar10 = vfmadd213ps_fma(auVar107,local_680,auVar126);
          fVar135 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar35._4_4_ = (auVar10._4_4_ + auVar10._4_4_) * fVar135;
          auVar35._0_4_ = (auVar10._0_4_ + auVar10._0_4_) * fVar135;
          auVar35._8_4_ = (auVar10._8_4_ + auVar10._8_4_) * fVar135;
          auVar35._12_4_ = (auVar10._12_4_ + auVar10._12_4_) * fVar135;
          auVar35._16_4_ = fVar135 * 0.0;
          auVar35._20_4_ = fVar135 * 0.0;
          auVar35._24_4_ = fVar135 * 0.0;
          auVar35._28_4_ = 0;
          auVar107 = vcmpps_avx(auVar99,auVar35,6);
          auVar130 = auVar152 & auVar107;
          auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,CONCAT416(
                                                  fVar110,CONCAT412(fVar112,CONCAT48(fVar110,uVar92)
                                                                   ))))));
          auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(
                                                  fVar202,CONCAT412(fVar202,CONCAT48(fVar202,
                                                  CONCAT44(fVar202,fVar202))))))));
          if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar130 >> 0x7f,0) != '\0') ||
                (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar130 >> 0xbf,0) != '\0') ||
              (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar130[0x1f] < '\0') {
            local_380 = vandps_avx(auVar107,auVar152);
            auVar131._8_4_ = 0xbf800000;
            auVar131._0_8_ = 0xbf800000bf800000;
            auVar131._12_4_ = 0xbf800000;
            auVar131._16_4_ = 0xbf800000;
            auVar131._20_4_ = 0xbf800000;
            auVar131._24_4_ = 0xbf800000;
            auVar131._28_4_ = 0xbf800000;
            auVar145._8_4_ = 0x40000000;
            auVar145._0_8_ = 0x4000000040000000;
            auVar145._12_4_ = 0x40000000;
            auVar145._16_4_ = 0x40000000;
            auVar145._20_4_ = 0x40000000;
            auVar145._24_4_ = 0x40000000;
            auVar145._28_4_ = 0x40000000;
            auVar10 = vfmadd213ps_fma(local_4e0,auVar145,auVar131);
            local_420 = ZEXT1632(auVar10);
            local_3e0 = 0;
            local_3d0 = local_730._0_8_;
            uStack_3c8 = local_730._8_8_;
            local_3c0 = local_620._0_8_;
            uStack_3b8 = local_620._8_8_;
            local_3b0 = local_630._0_8_;
            uStack_3a8 = local_630._8_8_;
            local_3a0 = local_570._0_8_;
            uStack_398 = local_570._8_8_;
            local_4e0 = local_420;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar91 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar135 = 1.0 / (float)local_540._0_4_;
                local_360[0] = fVar135 * (auVar156._0_4_ + 0.0);
                local_360[1] = fVar135 * (auVar156._4_4_ + 1.0);
                local_360[2] = fVar135 * (auVar156._8_4_ + 2.0);
                local_360[3] = fVar135 * (auVar156._12_4_ + 3.0);
                fStack_350 = fVar135 * (auVar156._16_4_ + 4.0);
                fStack_34c = fVar135 * (auVar156._20_4_ + 5.0);
                fStack_348 = fVar135 * (auVar156._24_4_ + 6.0);
                fStack_344 = auVar156._28_4_ + 7.0;
                local_4e0._0_8_ = auVar10._0_8_;
                local_4e0._8_8_ = auVar10._8_8_;
                local_340 = local_4e0._0_8_;
                uStack_338 = local_4e0._8_8_;
                uStack_330 = 0;
                uStack_328 = 0;
                local_320 = auVar99;
                uVar84 = vmovmskps_avx(local_380);
                bVar91 = uVar84 != 0;
                if (bVar91) {
                  uVar85 = 0;
                  uVar88 = (ulong)(uVar84 & 0xff);
                  for (uVar87 = uVar88; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000
                      ) {
                    uVar85 = uVar85 + 1;
                  }
                  local_6c0._4_4_ = uVar89;
                  local_6c0._0_4_ = uVar89;
                  local_6c0._8_4_ = uVar89;
                  local_6c0._12_4_ = uVar89;
                  local_6c0._16_4_ = uVar89;
                  local_6c0._20_4_ = uVar89;
                  local_6c0._24_4_ = uVar89;
                  local_6c0._28_4_ = uVar89;
                  local_780._0_4_ = local_780._4_4_;
                  local_780._8_4_ = local_780._4_4_;
                  local_780._12_4_ = local_780._4_4_;
                  local_780._16_4_ = local_780._4_4_;
                  local_780._20_4_ = local_780._4_4_;
                  local_780._24_4_ = local_780._4_4_;
                  local_780._28_4_ = local_780._4_4_;
                  _local_6e0 = ZEXT1632(local_620);
                  local_700 = ZEXT1632(local_630);
                  auStack_5b0 = auVar146._16_16_;
                  _local_5c0 = local_570;
                  local_6a0 = auVar99;
                  _local_4a0 = *pauVar1;
                  local_440 = local_680;
                  local_400 = auVar99;
                  local_3dc = iVar83;
                  do {
                    local_7a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_220 = local_360[uVar85];
                    uVar180 = *(undefined4 *)((long)&local_340 + uVar85 * 4);
                    local_200._4_4_ = uVar180;
                    local_200._0_4_ = uVar180;
                    local_200._8_4_ = uVar180;
                    local_200._12_4_ = uVar180;
                    local_200._16_4_ = uVar180;
                    local_200._20_4_ = uVar180;
                    local_200._24_4_ = uVar180;
                    local_200._28_4_ = uVar180;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar85 * 4);
                    fVar113 = 1.0 - local_220;
                    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar113 * fVar113)),
                                              ZEXT416((uint)(local_220 * fVar113)),
                                              ZEXT416(0xc0000000));
                    auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar113)),
                                              ZEXT416((uint)(local_220 * local_220)),
                                              ZEXT416(0x40000000));
                    fVar135 = auVar10._0_4_ * 3.0;
                    fVar111 = local_220 * local_220 * 3.0;
                    auVar166._0_4_ = fVar111 * (float)local_5c0._0_4_;
                    auVar166._4_4_ = fVar111 * (float)local_5c0._4_4_;
                    auVar166._8_4_ = fVar111 * fStack_5b8;
                    auVar166._12_4_ = fVar111 * fStack_5b4;
                    auVar141._4_4_ = fVar135;
                    auVar141._0_4_ = fVar135;
                    auVar141._8_4_ = fVar135;
                    auVar141._12_4_ = fVar135;
                    auVar10 = vfmadd132ps_fma(auVar141,auVar166,local_700._0_16_);
                    fVar135 = auVar12._0_4_ * 3.0;
                    auVar160._4_4_ = fVar135;
                    auVar160._0_4_ = fVar135;
                    auVar160._8_4_ = fVar135;
                    auVar160._12_4_ = fVar135;
                    auVar10 = vfmadd132ps_fma(auVar160,auVar10,_local_6e0);
                    fVar135 = fVar113 * fVar113 * -3.0;
                    local_7d0.context = context->user;
                    auVar142._4_4_ = fVar135;
                    auVar142._0_4_ = fVar135;
                    auVar142._8_4_ = fVar135;
                    auVar142._12_4_ = fVar135;
                    auVar12 = vfmadd132ps_fma(auVar142,auVar10,local_730);
                    local_280 = auVar12._0_4_;
                    uStack_27c = local_280;
                    uStack_278 = local_280;
                    uStack_274 = local_280;
                    uStack_270 = local_280;
                    uStack_26c = local_280;
                    uStack_268 = local_280;
                    uStack_264 = local_280;
                    auVar10 = vmovshdup_avx(auVar12);
                    local_260 = auVar10._0_8_;
                    uStack_258 = local_260;
                    uStack_250 = local_260;
                    uStack_248 = local_260;
                    auVar10 = vshufps_avx(auVar12,auVar12,0xaa);
                    local_240 = auVar10._0_8_;
                    uStack_238 = local_240;
                    uStack_230 = local_240;
                    uStack_228 = local_240;
                    fStack_21c = local_220;
                    fStack_218 = local_220;
                    fStack_214 = local_220;
                    fStack_210 = local_220;
                    fStack_20c = local_220;
                    fStack_208 = local_220;
                    fStack_204 = local_220;
                    local_1e0 = local_780._0_8_;
                    uStack_1d8 = local_780._8_8_;
                    uStack_1d0 = local_780._16_8_;
                    uStack_1c8 = local_780._24_8_;
                    local_1c0 = local_6c0;
                    auVar99 = vpcmpeqd_avx2(local_200,local_200);
                    local_1a0 = (local_7d0.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_7d0.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_660 = local_2e0._0_8_;
                    uStack_658 = local_2e0._8_8_;
                    uStack_650 = local_2e0._16_8_;
                    uStack_648 = local_2e0._24_8_;
                    local_7d0.valid = (int *)&local_660;
                    local_7d0.geometryUserPtr = pGVar8->userPtr;
                    local_7d0.hit = (RTCHitN *)&local_280;
                    local_7d0.N = 8;
                    local_7d0.ray = (RTCRayN *)ray;
                    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->occlusionFilterN)(&local_7d0);
                      auVar176._8_56_ = extraout_var;
                      auVar176._0_8_ = extraout_XMM1_Qa;
                      auVar207 = ZEXT3264(_local_720);
                      auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,
                                                  CONCAT416(fVar202,CONCAT412(fVar202,CONCAT48(
                                                  fVar202,CONCAT44(fVar202,fVar202))))))));
                      auVar197 = ZEXT3264(local_6a0);
                      auVar156 = ZEXT3264(local_680);
                      auVar99 = vpcmpeqd_avx2(auVar176._0_32_,auVar176._0_32_);
                    }
                    auVar146._8_8_ = uStack_658;
                    auVar146._0_8_ = local_660;
                    auVar146._16_8_ = uStack_650;
                    auVar146._24_8_ = uStack_648;
                    auVar152 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar146);
                    auVar109 = auVar99 & ~auVar152;
                    auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,
                                                  CONCAT416(fVar110,CONCAT412(fVar112,CONCAT48(
                                                  fVar110,uVar92)))))));
                    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar109 >> 0x7f,0) == '\0') &&
                          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar109 >> 0xbf,0) == '\0') &&
                        (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar109[0x1f]) {
                      auVar152 = auVar152 ^ auVar99;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_7d0);
                        auVar207 = ZEXT3264(_local_720);
                        auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,
                                                  CONCAT416(fVar202,CONCAT412(fVar202,CONCAT48(
                                                  fVar202,CONCAT44(fVar202,fVar202))))))));
                        auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,
                                                  CONCAT416(fVar110,CONCAT412(fVar112,CONCAT48(
                                                  fVar110,uVar92)))))));
                        auVar197 = ZEXT3264(local_6a0);
                        auVar156 = ZEXT3264(local_680);
                      }
                      auVar75._8_8_ = uStack_658;
                      auVar75._0_8_ = local_660;
                      auVar75._16_8_ = uStack_650;
                      auVar75._24_8_ = uStack_648;
                      auVar109 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                      auVar99 = vpcmpeqd_avx2(auVar109,auVar75);
                      auVar152 = vpcmpeqd_avx2(auVar109,auVar109);
                      auVar152 = auVar99 ^ auVar152;
                      auVar149._8_4_ = 0xff800000;
                      auVar149._0_8_ = 0xff800000ff800000;
                      auVar149._12_4_ = 0xff800000;
                      auVar149._16_4_ = 0xff800000;
                      auVar149._20_4_ = 0xff800000;
                      auVar149._24_4_ = 0xff800000;
                      auVar149._28_4_ = 0xff800000;
                      auVar99 = vblendvps_avx(auVar149,*(undefined1 (*) [32])(local_7d0.ray + 0x100)
                                              ,auVar99);
                      *(undefined1 (*) [32])(local_7d0.ray + 0x100) = auVar99;
                    }
                    auVar99 = auVar197._0_32_;
                    auVar109 = auVar156._0_32_;
                    if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar152 >> 0x7f,0) != '\0') ||
                          (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar152 >> 0xbf,0) != '\0') ||
                        (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar152[0x1f] < '\0') break;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_7a0._0_4_;
                    uVar87 = uVar85 & 0x3f;
                    uVar85 = 0;
                    uVar88 = uVar88 ^ 1L << uVar87;
                    for (uVar87 = uVar88; (uVar87 & 1) == 0;
                        uVar87 = uVar87 >> 1 | 0x8000000000000000) {
                      uVar85 = uVar85 + 1;
                    }
                    bVar91 = uVar88 != 0;
                  } while (bVar91);
                }
              }
              goto LAB_016a43c1;
            }
          }
          bVar91 = false;
        }
      }
LAB_016a43c1:
      local_680 = auVar109;
      auVar197 = ZEXT3264(auVar124);
      local_6a0 = auVar99;
      if (8 < iVar83) {
        local_4c0._4_4_ = iVar83;
        local_4c0._0_4_ = iVar83;
        local_4c0._8_4_ = iVar83;
        local_4c0._12_4_ = iVar83;
        local_4c0._16_4_ = iVar83;
        local_4c0._20_4_ = iVar83;
        local_4c0._24_4_ = iVar83;
        local_4c0._28_4_ = iVar83;
        local_e0 = fVar134;
        fStack_dc = fVar134;
        fStack_d8 = fVar134;
        fStack_d4 = fVar134;
        fStack_d0 = fVar134;
        fStack_cc = fVar134;
        fStack_c8 = fVar134;
        fStack_c4 = fVar134;
        local_100 = uVar118;
        uStack_fc = uVar118;
        uStack_f8 = uVar118;
        uStack_f4 = uVar118;
        uStack_f0 = uVar118;
        uStack_ec = uVar118;
        uStack_e8 = uVar118;
        uStack_e4 = uVar118;
        local_160 = 1.0 / (float)local_540._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_120 = uVar89;
        uStack_11c = uVar89;
        uStack_118 = uVar89;
        uStack_114 = uVar89;
        uStack_110 = uVar89;
        uStack_10c = uVar89;
        uStack_108 = uVar89;
        uStack_104 = uVar89;
        local_140 = local_5e0._0_4_;
        uStack_13c = local_5e0._0_4_;
        uStack_138 = local_5e0._0_4_;
        uStack_134 = local_5e0._0_4_;
        uStack_130 = local_5e0._0_4_;
        uStack_12c = local_5e0._0_4_;
        uStack_128 = local_5e0._0_4_;
        uStack_124 = local_5e0._0_4_;
        lVar86 = 8;
        auVar156 = ZEXT3264(local_760);
        _local_720 = auVar207._0_32_;
        do {
          auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 * 4 + lVar16);
          auVar109 = *(undefined1 (*) [32])(lVar16 + 0x2227768 + lVar86 * 4);
          auVar152 = *(undefined1 (*) [32])(lVar16 + 0x2227bec + lVar86 * 4);
          pauVar1 = (undefined1 (*) [32])(lVar16 + 0x2228070 + lVar86 * 4);
          auVar78 = *(undefined1 (*) [28])*pauVar1;
          auVar208._0_4_ = auVar187._0_4_ * *(float *)*pauVar1;
          auVar208._4_4_ = auVar187._4_4_ * *(float *)(*pauVar1 + 4);
          auVar208._8_4_ = auVar187._8_4_ * *(float *)(*pauVar1 + 8);
          auVar208._12_4_ = auVar187._12_4_ * *(float *)(*pauVar1 + 0xc);
          auVar208._16_4_ = auVar187._16_4_ * *(float *)(*pauVar1 + 0x10);
          auVar208._20_4_ = auVar187._20_4_ * *(float *)(*pauVar1 + 0x14);
          auVar208._28_36_ = auVar207._28_36_;
          auVar208._24_4_ = auVar187._24_4_ * *(float *)(*pauVar1 + 0x18);
          auVar36._4_4_ = auVar176._4_4_ * *(float *)(*pauVar1 + 4);
          auVar36._0_4_ = auVar176._0_4_ * *(float *)*pauVar1;
          auVar36._8_4_ = auVar176._8_4_ * *(float *)(*pauVar1 + 8);
          auVar36._12_4_ = auVar176._12_4_ * *(float *)(*pauVar1 + 0xc);
          auVar36._16_4_ = auVar176._16_4_ * *(float *)(*pauVar1 + 0x10);
          auVar36._20_4_ = auVar176._20_4_ * *(float *)(*pauVar1 + 0x14);
          auVar36._24_4_ = auVar176._24_4_ * *(float *)(*pauVar1 + 0x18);
          auVar36._28_4_ = *(undefined4 *)(*pauVar1 + 0x1c);
          auVar196 = auVar197._0_32_;
          auVar10 = vfmadd231ps_fma(auVar208._0_32_,auVar152,auVar196);
          auVar12 = vfmadd231ps_fma(auVar36,auVar152,auVar199);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar109,auVar173);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar109,auVar156._0_32_);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar99,auVar167);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar99,local_5a0);
          auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 * 4 + lVar16);
          local_700 = *(undefined1 (*) [32])(lVar16 + 0x2229b88 + lVar86 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar16 + 0x222a00c + lVar86 * 4);
          pauVar2 = (undefined1 (*) [16])(lVar16 + 0x222a490 + lVar86 * 4);
          fVar117 = *(float *)*pauVar2;
          fVar66 = *(float *)(*pauVar2 + 4);
          fVar67 = *(float *)(*pauVar2 + 8);
          auVar79 = *(undefined1 (*) [12])*pauVar2;
          fVar68 = *(float *)(*pauVar2 + 0xc);
          fStack_530 = *(float *)pauVar2[1];
          fStack_52c = *(float *)(pauVar2[1] + 4);
          fStack_528 = *(float *)(pauVar2[1] + 8);
          uStack_524 = *(undefined4 *)(pauVar2[1] + 0xc);
          auVar188._0_4_ = auVar187._0_4_ * fVar117;
          auVar188._4_4_ = auVar187._4_4_ * fVar66;
          auVar188._8_4_ = auVar187._8_4_ * fVar67;
          auVar188._12_4_ = auVar187._12_4_ * fVar68;
          auVar188._16_4_ = auVar187._16_4_ * fStack_530;
          auVar188._20_4_ = auVar187._20_4_ * fStack_52c;
          auVar188._28_36_ = auVar187._28_36_;
          auVar188._24_4_ = auVar187._24_4_ * fStack_528;
          auVar207._0_4_ = fVar117 * auVar176._0_4_;
          auVar207._4_4_ = fVar66 * auVar176._4_4_;
          auVar207._8_4_ = fVar67 * auVar176._8_4_;
          auVar207._12_4_ = fVar68 * auVar176._12_4_;
          auVar207._16_4_ = fStack_530 * auVar176._16_4_;
          auVar207._20_4_ = fStack_52c * auVar176._20_4_;
          auVar207._28_36_ = auVar156._28_36_;
          auVar207._24_4_ = fStack_528 * auVar176._24_4_;
          auVar13 = vfmadd231ps_fma(auVar188._0_32_,auVar107,auVar196);
          auVar14 = vfmadd231ps_fma(auVar207._0_32_,auVar107,auVar199);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_700,auVar173);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_700,auVar156._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar101,auVar167);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar101,local_5a0);
          auVar184 = ZEXT1632(auVar13);
          auVar205 = ZEXT1632(auVar10);
          _local_5c0 = vsubps_avx(auVar184,auVar205);
          auVar108 = ZEXT1632(auVar14);
          auVar146 = ZEXT1632(auVar12);
          _local_4a0 = vsubps_avx(auVar108,auVar146);
          auVar65._4_4_ = local_5c0._4_4_ * auVar12._4_4_;
          auVar65._0_4_ = local_5c0._0_4_ * auVar12._0_4_;
          auVar65._8_4_ = local_5c0._8_4_ * auVar12._8_4_;
          auVar65._12_4_ = local_5c0._12_4_ * auVar12._12_4_;
          auVar65._16_4_ = local_5c0._16_4_ * 0.0;
          auVar65._20_4_ = local_5c0._20_4_ * 0.0;
          auVar65._24_4_ = local_5c0._24_4_ * 0.0;
          auVar65._28_4_ = local_5a0._28_4_;
          fVar134 = local_4a0._0_4_;
          fVar135 = local_4a0._4_4_;
          auVar80._4_4_ = auVar10._4_4_ * fVar135;
          auVar80._0_4_ = auVar10._0_4_ * fVar134;
          fVar111 = local_4a0._8_4_;
          auVar80._8_4_ = auVar10._8_4_ * fVar111;
          fVar113 = local_4a0._12_4_;
          auVar80._12_4_ = auVar10._12_4_ * fVar113;
          fVar114 = local_4a0._16_4_;
          auVar80._16_4_ = fVar114 * 0.0;
          fVar115 = local_4a0._20_4_;
          auVar80._20_4_ = fVar115 * 0.0;
          fVar116 = local_4a0._24_4_;
          auVar80._24_4_ = fVar116 * 0.0;
          auVar80._28_4_ = auVar11._4_4_;
          auVar207 = ZEXT3264(*pauVar1);
          auVar6 = vsubps_avx(auVar65,auVar80);
          auVar197._0_4_ = auVar78._0_4_ * (float)local_2c0._0_4_;
          auVar197._4_4_ = auVar78._4_4_ * (float)local_2c0._4_4_;
          auVar197._8_4_ = auVar78._8_4_ * fStack_2b8;
          auVar197._12_4_ = auVar78._12_4_ * fStack_2b4;
          auVar197._16_4_ = auVar78._16_4_ * fStack_2b0;
          auVar197._20_4_ = auVar78._20_4_ * fStack_2ac;
          auVar197._28_36_ = auVar176._28_36_;
          auVar197._24_4_ = auVar78._24_4_ * fStack_2a8;
          auVar10 = vfmadd231ps_fma(auVar197._0_32_,auVar152,local_a0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar109,local_80);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_2a0,auVar99);
          auVar37._4_4_ = fVar66 * (float)local_2c0._4_4_;
          auVar37._0_4_ = fVar117 * (float)local_2c0._0_4_;
          auVar37._8_4_ = fVar67 * fStack_2b8;
          auVar37._12_4_ = fVar68 * fStack_2b4;
          auVar37._16_4_ = fStack_530 * fStack_2b0;
          auVar37._20_4_ = fStack_52c * fStack_2ac;
          auVar37._24_4_ = fStack_528 * fStack_2a8;
          auVar37._28_4_ = uStack_2a4;
          auVar12 = vfmadd231ps_fma(auVar37,auVar107,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_700,local_80);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar101,local_2a0);
          auVar38._4_4_ = fVar135 * fVar135;
          auVar38._0_4_ = fVar134 * fVar134;
          auVar38._8_4_ = fVar111 * fVar111;
          auVar38._12_4_ = fVar113 * fVar113;
          auVar38._16_4_ = fVar114 * fVar114;
          auVar38._20_4_ = fVar115 * fVar115;
          auVar38._24_4_ = fVar116 * fVar116;
          auVar38._28_4_ = local_2a0._28_4_;
          auVar13 = vfmadd231ps_fma(auVar38,_local_5c0,_local_5c0);
          auVar132 = ZEXT1632(auVar12);
          auVar130 = vmaxps_avx(ZEXT1632(auVar10),auVar132);
          auVar191._0_4_ = auVar130._0_4_ * auVar130._0_4_ * auVar13._0_4_;
          auVar191._4_4_ = auVar130._4_4_ * auVar130._4_4_ * auVar13._4_4_;
          auVar191._8_4_ = auVar130._8_4_ * auVar130._8_4_ * auVar13._8_4_;
          auVar191._12_4_ = auVar130._12_4_ * auVar130._12_4_ * auVar13._12_4_;
          auVar191._16_4_ = auVar130._16_4_ * auVar130._16_4_ * 0.0;
          auVar191._20_4_ = auVar130._20_4_ * auVar130._20_4_ * 0.0;
          auVar191._24_4_ = auVar130._24_4_ * auVar130._24_4_ * 0.0;
          auVar191._28_4_ = 0;
          auVar39._4_4_ = auVar6._4_4_ * auVar6._4_4_;
          auVar39._0_4_ = auVar6._0_4_ * auVar6._0_4_;
          auVar39._8_4_ = auVar6._8_4_ * auVar6._8_4_;
          auVar39._12_4_ = auVar6._12_4_ * auVar6._12_4_;
          auVar39._16_4_ = auVar6._16_4_ * auVar6._16_4_;
          auVar39._20_4_ = auVar6._20_4_ * auVar6._20_4_;
          auVar39._24_4_ = auVar6._24_4_ * auVar6._24_4_;
          auVar39._28_4_ = auVar6._28_4_;
          auVar130 = vcmpps_avx(auVar39,auVar191,2);
          local_3e0 = (int)lVar86;
          auVar192._4_4_ = local_3e0;
          auVar192._0_4_ = local_3e0;
          auVar192._8_4_ = local_3e0;
          auVar192._12_4_ = local_3e0;
          auVar192._16_4_ = local_3e0;
          auVar192._20_4_ = local_3e0;
          auVar192._24_4_ = local_3e0;
          auVar192._28_4_ = local_3e0;
          auVar6 = vpor_avx2(auVar192,_DAT_0205a920);
          auVar190 = vpcmpgtd_avx2(local_4c0,auVar6);
          auVar6 = auVar190 & auVar130;
          if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar6 >> 0x7f,0) == '\0') &&
                (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar6 >> 0xbf,0) == '\0') &&
              (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar6[0x1f]) {
            auVar156 = ZEXT3264(local_760);
            auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,CONCAT416(
                                                  fVar110,CONCAT412(fVar112,CONCAT48(fVar110,uVar92)
                                                                   ))))));
            auVar197 = ZEXT3264(auVar196);
            auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(
                                                  fVar202,CONCAT412(fVar202,CONCAT48(fVar202,
                                                  CONCAT44(fVar202,fVar202))))))));
          }
          else {
            local_c0 = vandps_avx(auVar190,auVar130);
            local_540._0_4_ = auVar79._0_4_;
            local_540._4_4_ = auVar79._4_4_;
            fStack_538 = auVar79._8_4_;
            auVar40._4_4_ = (float)local_720._4_4_ * (float)local_540._4_4_;
            auVar40._0_4_ = (float)local_720._0_4_ * (float)local_540._0_4_;
            auVar40._8_4_ = fStack_718 * fStack_538;
            auVar40._12_4_ = fStack_714 * fVar68;
            auVar40._16_4_ = fStack_710 * fStack_530;
            auVar40._20_4_ = fStack_70c * fStack_52c;
            auVar40._24_4_ = fStack_708 * fStack_528;
            auVar40._28_4_ = auVar130._28_4_;
            auVar12 = vfmadd213ps_fma(auVar107,local_480,auVar40);
            auVar12 = vfmadd213ps_fma(local_700,local_520,ZEXT1632(auVar12));
            auVar12 = vfmadd132ps_fma(auVar101,ZEXT1632(auVar12),auVar168);
            auVar41._4_4_ = auVar78._4_4_ * (float)local_720._4_4_;
            auVar41._0_4_ = auVar78._0_4_ * (float)local_720._0_4_;
            auVar41._8_4_ = auVar78._8_4_ * fStack_718;
            auVar41._12_4_ = auVar78._12_4_ * fStack_714;
            auVar41._16_4_ = auVar78._16_4_ * fStack_710;
            auVar41._20_4_ = auVar78._20_4_ * fStack_70c;
            auVar41._24_4_ = auVar78._24_4_ * fStack_708;
            auVar41._28_4_ = auVar130._28_4_;
            auVar13 = vfmadd213ps_fma(auVar152,local_480,auVar41);
            auVar13 = vfmadd213ps_fma(auVar109,local_520,ZEXT1632(auVar13));
            auVar109 = *(undefined1 (*) [32])(lVar16 + 0x22284f4 + lVar86 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar16 + 0x2228978 + lVar86 * 4);
            auVar130 = *(undefined1 (*) [32])(lVar16 + 0x2228dfc + lVar86 * 4);
            pfVar3 = (float *)(lVar16 + 0x2229280 + lVar86 * 4);
            fVar134 = *pfVar3;
            fVar135 = pfVar3[1];
            fVar111 = pfVar3[2];
            fVar113 = pfVar3[3];
            fVar114 = pfVar3[4];
            fVar115 = pfVar3[5];
            fVar116 = pfVar3[6];
            auVar185._0_4_ = fVar134 * fVar202;
            auVar185._4_4_ = fVar135 * fVar202;
            auVar185._8_4_ = fVar111 * fVar202;
            auVar185._12_4_ = fVar113 * fVar202;
            auVar185._16_4_ = fVar114 * fVar202;
            auVar185._20_4_ = fVar115 * fVar202;
            auVar185._24_4_ = fVar116 * fVar202;
            auVar185._28_4_ = 0;
            auVar42._4_4_ = fVar135 * fVar112;
            auVar42._0_4_ = fVar134 * fVar110;
            auVar42._8_4_ = fVar111 * fVar110;
            auVar42._12_4_ = fVar113 * fVar112;
            auVar42._16_4_ = fVar114 * fVar110;
            auVar42._20_4_ = fVar115 * fVar112;
            auVar42._24_4_ = fVar116 * fVar110;
            auVar42._28_4_ = *(undefined4 *)(*pauVar1 + 0x1c);
            auVar43._4_4_ = fVar135 * (float)local_720._4_4_;
            auVar43._0_4_ = fVar134 * (float)local_720._0_4_;
            auVar43._8_4_ = fVar111 * fStack_718;
            auVar43._12_4_ = fVar113 * fStack_714;
            auVar43._16_4_ = fVar114 * fStack_710;
            auVar43._20_4_ = fVar115 * fStack_70c;
            auVar43._24_4_ = fVar116 * fStack_708;
            auVar43._28_4_ = pfVar3[7];
            auVar14 = vfmadd231ps_fma(auVar185,auVar130,auVar196);
            auVar15 = vfmadd231ps_fma(auVar42,auVar130,auVar199);
            auVar96 = vfmadd231ps_fma(auVar43,local_480,auVar130);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar107,auVar173);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar107,local_760);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),local_520,auVar107);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar109,auVar167);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar109,local_5a0);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar109,auVar168);
            pfVar3 = (float *)(lVar16 + 0x222b6a0 + lVar86 * 4);
            fVar134 = *pfVar3;
            fVar135 = pfVar3[1];
            fVar111 = pfVar3[2];
            fVar113 = pfVar3[3];
            fVar114 = pfVar3[4];
            fVar115 = pfVar3[5];
            fVar116 = pfVar3[6];
            auVar44._4_4_ = fVar202 * fVar135;
            auVar44._0_4_ = fVar202 * fVar134;
            auVar44._8_4_ = fVar202 * fVar111;
            auVar44._12_4_ = fVar202 * fVar113;
            auVar44._16_4_ = fVar202 * fVar114;
            auVar44._20_4_ = fVar202 * fVar115;
            auVar44._24_4_ = fVar202 * fVar116;
            auVar44._28_4_ = local_5c0._28_4_;
            auVar45._4_4_ = fVar112 * fVar135;
            auVar45._0_4_ = fVar110 * fVar134;
            auVar45._8_4_ = fVar110 * fVar111;
            auVar45._12_4_ = fVar112 * fVar113;
            auVar45._16_4_ = fVar110 * fVar114;
            auVar45._20_4_ = fVar112 * fVar115;
            auVar45._24_4_ = fVar110 * fVar116;
            auVar45._28_4_ = local_4a0._28_4_;
            auVar46._4_4_ = fVar135 * (float)local_720._4_4_;
            auVar46._0_4_ = fVar134 * (float)local_720._0_4_;
            auVar46._8_4_ = fVar111 * fStack_718;
            auVar46._12_4_ = fVar113 * fStack_714;
            auVar46._16_4_ = fVar114 * fStack_710;
            auVar46._20_4_ = fVar115 * fStack_70c;
            auVar46._24_4_ = fVar116 * fStack_708;
            auVar46._28_4_ = pfVar3[7];
            auVar109 = *(undefined1 (*) [32])(lVar16 + 0x222b21c + lVar86 * 4);
            auVar95 = vfmadd231ps_fma(auVar44,auVar109,auVar196);
            auVar136 = vfmadd231ps_fma(auVar45,auVar109,auVar199);
            auVar121 = vfmadd231ps_fma(auVar46,local_480,auVar109);
            auVar109 = *(undefined1 (*) [32])(lVar16 + 0x222ad98 + lVar86 * 4);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar109,auVar173);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar109,local_760);
            auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar109,local_520);
            auVar109 = *(undefined1 (*) [32])(lVar16 + 0x222a914 + lVar86 * 4);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar109,auVar167);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar109,local_5a0);
            auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar168,auVar109);
            auVar193._8_4_ = 0x7fffffff;
            auVar193._0_8_ = 0x7fffffff7fffffff;
            auVar193._12_4_ = 0x7fffffff;
            auVar193._16_4_ = 0x7fffffff;
            auVar193._20_4_ = 0x7fffffff;
            auVar193._24_4_ = 0x7fffffff;
            auVar193._28_4_ = 0x7fffffff;
            auVar109 = vandps_avx(ZEXT1632(auVar14),auVar193);
            auVar107 = vandps_avx(ZEXT1632(auVar15),auVar193);
            auVar107 = vmaxps_avx(auVar109,auVar107);
            auVar109 = vandps_avx(ZEXT1632(auVar96),auVar193);
            auVar109 = vmaxps_avx(auVar107,auVar109);
            auVar77._4_4_ = fStack_dc;
            auVar77._0_4_ = local_e0;
            auVar77._8_4_ = fStack_d8;
            auVar77._12_4_ = fStack_d4;
            auVar77._16_4_ = fStack_d0;
            auVar77._20_4_ = fStack_cc;
            auVar77._24_4_ = fStack_c8;
            auVar77._28_4_ = fStack_c4;
            auVar109 = vcmpps_avx(auVar109,auVar77,1);
            auVar130 = vblendvps_avx(ZEXT1632(auVar14),_local_5c0,auVar109);
            auVar6 = vblendvps_avx(ZEXT1632(auVar15),_local_4a0,auVar109);
            auVar109 = vandps_avx(ZEXT1632(auVar95),auVar193);
            auVar107 = vandps_avx(ZEXT1632(auVar136),auVar193);
            auVar107 = vmaxps_avx(auVar109,auVar107);
            auVar109 = vandps_avx(auVar193,ZEXT1632(auVar121));
            auVar109 = vmaxps_avx(auVar107,auVar109);
            auVar107 = vcmpps_avx(auVar109,auVar77,1);
            auVar109 = vblendvps_avx(ZEXT1632(auVar95),_local_5c0,auVar107);
            auVar107 = vblendvps_avx(ZEXT1632(auVar136),_local_4a0,auVar107);
            auVar13 = vfmadd213ps_fma(auVar99,auVar168,ZEXT1632(auVar13));
            auVar14 = vfmadd213ps_fma(auVar130,auVar130,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar6,auVar6);
            auVar99 = vrsqrtps_avx(ZEXT1632(auVar14));
            fVar134 = auVar99._0_4_;
            fVar135 = auVar99._4_4_;
            fVar111 = auVar99._8_4_;
            fVar113 = auVar99._12_4_;
            fVar114 = auVar99._16_4_;
            fVar115 = auVar99._20_4_;
            fVar116 = auVar99._24_4_;
            auVar47._4_4_ = fVar135 * fVar135 * fVar135 * auVar14._4_4_ * -0.5;
            auVar47._0_4_ = fVar134 * fVar134 * fVar134 * auVar14._0_4_ * -0.5;
            auVar47._8_4_ = fVar111 * fVar111 * fVar111 * auVar14._8_4_ * -0.5;
            auVar47._12_4_ = fVar113 * fVar113 * fVar113 * auVar14._12_4_ * -0.5;
            auVar47._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar47._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar47._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar47._28_4_ = 0;
            auVar213._8_4_ = 0x3fc00000;
            auVar213._0_8_ = 0x3fc000003fc00000;
            auVar213._12_4_ = 0x3fc00000;
            auVar213._16_4_ = 0x3fc00000;
            auVar213._20_4_ = 0x3fc00000;
            auVar213._24_4_ = 0x3fc00000;
            auVar213._28_4_ = 0x3fc00000;
            auVar14 = vfmadd231ps_fma(auVar47,auVar213,auVar99);
            fVar134 = auVar14._0_4_;
            fVar135 = auVar14._4_4_;
            auVar48._4_4_ = auVar6._4_4_ * fVar135;
            auVar48._0_4_ = auVar6._0_4_ * fVar134;
            fVar111 = auVar14._8_4_;
            auVar48._8_4_ = auVar6._8_4_ * fVar111;
            fVar113 = auVar14._12_4_;
            auVar48._12_4_ = auVar6._12_4_ * fVar113;
            auVar48._16_4_ = auVar6._16_4_ * 0.0;
            auVar48._20_4_ = auVar6._20_4_ * 0.0;
            auVar48._24_4_ = auVar6._24_4_ * 0.0;
            auVar48._28_4_ = auVar99._28_4_;
            auVar49._4_4_ = fVar135 * -auVar130._4_4_;
            auVar49._0_4_ = fVar134 * -auVar130._0_4_;
            auVar49._8_4_ = fVar111 * -auVar130._8_4_;
            auVar49._12_4_ = fVar113 * -auVar130._12_4_;
            auVar49._16_4_ = -auVar130._16_4_ * 0.0;
            auVar49._20_4_ = -auVar130._20_4_ * 0.0;
            auVar49._24_4_ = -auVar130._24_4_ * 0.0;
            auVar49._28_4_ = auVar6._28_4_;
            auVar14 = vfmadd213ps_fma(auVar109,auVar109,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar107,auVar107);
            auVar99 = vrsqrtps_avx(ZEXT1632(auVar14));
            auVar50._28_4_ = local_4a0._28_4_;
            auVar50._0_28_ =
                 ZEXT1628(CONCAT412(fVar113 * 0.0,
                                    CONCAT48(fVar111 * 0.0,CONCAT44(fVar135 * 0.0,fVar134 * 0.0))));
            fVar134 = auVar99._0_4_;
            fVar135 = auVar99._4_4_;
            fVar111 = auVar99._8_4_;
            fVar113 = auVar99._12_4_;
            fVar114 = auVar99._16_4_;
            fVar115 = auVar99._20_4_;
            fVar116 = auVar99._24_4_;
            auVar51._4_4_ = fVar135 * fVar135 * fVar135 * auVar14._4_4_ * -0.5;
            auVar51._0_4_ = fVar134 * fVar134 * fVar134 * auVar14._0_4_ * -0.5;
            auVar51._8_4_ = fVar111 * fVar111 * fVar111 * auVar14._8_4_ * -0.5;
            auVar51._12_4_ = fVar113 * fVar113 * fVar113 * auVar14._12_4_ * -0.5;
            auVar51._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar51._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar51._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar51._28_4_ = 0;
            auVar14 = vfmadd231ps_fma(auVar51,auVar213,auVar99);
            fVar134 = auVar14._0_4_;
            fVar135 = auVar14._4_4_;
            auVar52._4_4_ = auVar107._4_4_ * fVar135;
            auVar52._0_4_ = auVar107._0_4_ * fVar134;
            fVar111 = auVar14._8_4_;
            auVar52._8_4_ = auVar107._8_4_ * fVar111;
            fVar113 = auVar14._12_4_;
            auVar52._12_4_ = auVar107._12_4_ * fVar113;
            auVar52._16_4_ = auVar107._16_4_ * 0.0;
            auVar52._20_4_ = auVar107._20_4_ * 0.0;
            auVar52._24_4_ = auVar107._24_4_ * 0.0;
            auVar52._28_4_ = 0;
            auVar53._4_4_ = fVar135 * -auVar109._4_4_;
            auVar53._0_4_ = fVar134 * -auVar109._0_4_;
            auVar53._8_4_ = fVar111 * -auVar109._8_4_;
            auVar53._12_4_ = fVar113 * -auVar109._12_4_;
            auVar53._16_4_ = -auVar109._16_4_ * 0.0;
            auVar53._20_4_ = -auVar109._20_4_ * 0.0;
            auVar53._24_4_ = -auVar109._24_4_ * 0.0;
            auVar53._28_4_ = auVar99._28_4_;
            auVar54._28_4_ = 0xbf000000;
            auVar54._0_28_ =
                 ZEXT1628(CONCAT412(fVar113 * 0.0,
                                    CONCAT48(fVar111 * 0.0,CONCAT44(fVar135 * 0.0,fVar134 * 0.0))));
            auVar14 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar10),auVar205);
            auVar99 = ZEXT1632(auVar10);
            auVar15 = vfmadd213ps_fma(auVar49,auVar99,auVar146);
            auVar96 = vfmadd213ps_fma(auVar50,auVar99,ZEXT1632(auVar13));
            auVar94 = vfnmadd213ps_fma(auVar48,auVar99,auVar205);
            auVar95 = vfmadd213ps_fma(auVar52,auVar132,auVar184);
            auVar122 = vfnmadd213ps_fma(auVar49,auVar99,auVar146);
            auVar136 = vfmadd213ps_fma(auVar53,auVar132,auVar108);
            auVar125 = ZEXT1632(auVar10);
            auVar93 = vfnmadd231ps_fma(ZEXT1632(auVar13),auVar125,auVar50);
            auVar13 = vfmadd213ps_fma(auVar54,auVar132,ZEXT1632(auVar12));
            auVar150 = vfnmadd213ps_fma(auVar52,auVar132,auVar184);
            auVar158 = vfnmadd213ps_fma(auVar53,auVar132,auVar108);
            auVar120 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar132,auVar54);
            auVar99 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar122));
            auVar109 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar93));
            auVar174._0_4_ = auVar99._0_4_ * auVar93._0_4_;
            auVar174._4_4_ = auVar99._4_4_ * auVar93._4_4_;
            auVar174._8_4_ = auVar99._8_4_ * auVar93._8_4_;
            auVar174._12_4_ = auVar99._12_4_ * auVar93._12_4_;
            auVar174._16_4_ = auVar99._16_4_ * 0.0;
            auVar174._20_4_ = auVar99._20_4_ * 0.0;
            auVar174._24_4_ = auVar99._24_4_ * 0.0;
            auVar174._28_4_ = 0;
            auVar121 = vfmsub231ps_fma(auVar174,ZEXT1632(auVar122),auVar109);
            auVar55._4_4_ = auVar94._4_4_ * auVar109._4_4_;
            auVar55._0_4_ = auVar94._0_4_ * auVar109._0_4_;
            auVar55._8_4_ = auVar94._8_4_ * auVar109._8_4_;
            auVar55._12_4_ = auVar94._12_4_ * auVar109._12_4_;
            auVar55._16_4_ = auVar109._16_4_ * 0.0;
            auVar55._20_4_ = auVar109._20_4_ * 0.0;
            auVar55._24_4_ = auVar109._24_4_ * 0.0;
            auVar55._28_4_ = auVar109._28_4_;
            auVar101 = ZEXT1632(auVar94);
            auVar109 = vsubps_avx(ZEXT1632(auVar95),auVar101);
            auVar108 = ZEXT1632(auVar93);
            auVar12 = vfmsub231ps_fma(auVar55,auVar108,auVar109);
            auVar56._4_4_ = auVar122._4_4_ * auVar109._4_4_;
            auVar56._0_4_ = auVar122._0_4_ * auVar109._0_4_;
            auVar56._8_4_ = auVar122._8_4_ * auVar109._8_4_;
            auVar56._12_4_ = auVar122._12_4_ * auVar109._12_4_;
            auVar56._16_4_ = auVar109._16_4_ * 0.0;
            auVar56._20_4_ = auVar109._20_4_ * 0.0;
            auVar56._24_4_ = auVar109._24_4_ * 0.0;
            auVar56._28_4_ = auVar109._28_4_;
            auVar94 = vfmsub231ps_fma(auVar56,auVar101,auVar99);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar121));
            auVar184 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,2);
            auVar99 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar14),auVar184);
            auVar109 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar15),auVar184);
            auVar107 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar96),auVar184);
            auVar130 = vblendvps_avx(auVar101,ZEXT1632(auVar95),auVar184);
            auVar6 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar136),auVar184);
            auVar190 = vblendvps_avx(auVar108,ZEXT1632(auVar13),auVar184);
            auVar101 = vblendvps_avx(ZEXT1632(auVar95),auVar101,auVar184);
            auVar146 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar122),auVar184);
            auVar12 = vpackssdw_avx(local_c0._0_16_,local_c0._16_16_);
            auVar108 = vblendvps_avx(ZEXT1632(auVar13),auVar108,auVar184);
            auVar101 = vsubps_avx(auVar101,auVar99);
            auVar146 = vsubps_avx(auVar146,auVar109);
            auVar196 = vsubps_avx(auVar108,auVar107);
            auVar207 = ZEXT3264(auVar196);
            auVar205 = vsubps_avx(auVar99,auVar130);
            auVar100 = vsubps_avx(auVar109,auVar6);
            auVar102 = vsubps_avx(auVar107,auVar190);
            auVar170._0_4_ = auVar196._0_4_ * auVar99._0_4_;
            auVar170._4_4_ = auVar196._4_4_ * auVar99._4_4_;
            auVar170._8_4_ = auVar196._8_4_ * auVar99._8_4_;
            auVar170._12_4_ = auVar196._12_4_ * auVar99._12_4_;
            auVar170._16_4_ = auVar196._16_4_ * auVar99._16_4_;
            auVar170._20_4_ = auVar196._20_4_ * auVar99._20_4_;
            auVar170._24_4_ = auVar196._24_4_ * auVar99._24_4_;
            auVar170._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar170,auVar107,auVar101);
            auVar57._4_4_ = auVar101._4_4_ * auVar109._4_4_;
            auVar57._0_4_ = auVar101._0_4_ * auVar109._0_4_;
            auVar57._8_4_ = auVar101._8_4_ * auVar109._8_4_;
            auVar57._12_4_ = auVar101._12_4_ * auVar109._12_4_;
            auVar57._16_4_ = auVar101._16_4_ * auVar109._16_4_;
            auVar57._20_4_ = auVar101._20_4_ * auVar109._20_4_;
            auVar57._24_4_ = auVar101._24_4_ * auVar109._24_4_;
            auVar57._28_4_ = auVar108._28_4_;
            auVar14 = vfmsub231ps_fma(auVar57,auVar99,auVar146);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar171._0_4_ = auVar146._0_4_ * auVar107._0_4_;
            auVar171._4_4_ = auVar146._4_4_ * auVar107._4_4_;
            auVar171._8_4_ = auVar146._8_4_ * auVar107._8_4_;
            auVar171._12_4_ = auVar146._12_4_ * auVar107._12_4_;
            auVar171._16_4_ = auVar146._16_4_ * auVar107._16_4_;
            auVar171._20_4_ = auVar146._20_4_ * auVar107._20_4_;
            auVar171._24_4_ = auVar146._24_4_ * auVar107._24_4_;
            auVar171._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar171,auVar109,auVar196);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar172._0_4_ = auVar102._0_4_ * auVar130._0_4_;
            auVar172._4_4_ = auVar102._4_4_ * auVar130._4_4_;
            auVar172._8_4_ = auVar102._8_4_ * auVar130._8_4_;
            auVar172._12_4_ = auVar102._12_4_ * auVar130._12_4_;
            auVar172._16_4_ = auVar102._16_4_ * auVar130._16_4_;
            auVar172._20_4_ = auVar102._20_4_ * auVar130._20_4_;
            auVar172._24_4_ = auVar102._24_4_ * auVar130._24_4_;
            auVar172._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar172,auVar205,auVar190);
            auVar58._4_4_ = auVar100._4_4_ * auVar190._4_4_;
            auVar58._0_4_ = auVar100._0_4_ * auVar190._0_4_;
            auVar58._8_4_ = auVar100._8_4_ * auVar190._8_4_;
            auVar58._12_4_ = auVar100._12_4_ * auVar190._12_4_;
            auVar58._16_4_ = auVar100._16_4_ * auVar190._16_4_;
            auVar58._20_4_ = auVar100._20_4_ * auVar190._20_4_;
            auVar58._24_4_ = auVar100._24_4_ * auVar190._24_4_;
            auVar58._28_4_ = auVar190._28_4_;
            auVar15 = vfmsub231ps_fma(auVar58,auVar6,auVar102);
            auVar59._4_4_ = auVar205._4_4_ * auVar6._4_4_;
            auVar59._0_4_ = auVar205._0_4_ * auVar6._0_4_;
            auVar59._8_4_ = auVar205._8_4_ * auVar6._8_4_;
            auVar59._12_4_ = auVar205._12_4_ * auVar6._12_4_;
            auVar59._16_4_ = auVar205._16_4_ * auVar6._16_4_;
            auVar59._20_4_ = auVar205._20_4_ * auVar6._20_4_;
            auVar59._24_4_ = auVar205._24_4_ * auVar6._24_4_;
            auVar59._28_4_ = auVar6._28_4_;
            auVar96 = vfmsub231ps_fma(auVar59,auVar100,auVar130);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar130 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
            auVar130 = vcmpps_avx(auVar130,ZEXT832(0) << 0x20,2);
            auVar13 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
            auVar13 = vpand_avx(auVar13,auVar12);
            auVar130 = vpmovsxwd_avx2(auVar13);
            if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar130 >> 0x7f,0) == '\0') &&
                  (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar130 >> 0xbf,0) == '\0') &&
                (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar130[0x1f]) {
LAB_016a5259:
              auVar155._8_8_ = uStack_5f8;
              auVar155._0_8_ = local_600;
              auVar155._16_8_ = uStack_5f0;
              auVar155._24_8_ = uStack_5e8;
            }
            else {
              auVar60._4_4_ = auVar146._4_4_ * auVar102._4_4_;
              auVar60._0_4_ = auVar146._0_4_ * auVar102._0_4_;
              auVar60._8_4_ = auVar146._8_4_ * auVar102._8_4_;
              auVar60._12_4_ = auVar146._12_4_ * auVar102._12_4_;
              auVar60._16_4_ = auVar146._16_4_ * auVar102._16_4_;
              auVar60._20_4_ = auVar146._20_4_ * auVar102._20_4_;
              auVar60._24_4_ = auVar146._24_4_ * auVar102._24_4_;
              auVar60._28_4_ = auVar130._28_4_;
              auVar121 = vfmsub231ps_fma(auVar60,auVar100,auVar196);
              auVar175._0_4_ = auVar196._0_4_ * auVar205._0_4_;
              auVar175._4_4_ = auVar196._4_4_ * auVar205._4_4_;
              auVar175._8_4_ = auVar196._8_4_ * auVar205._8_4_;
              auVar175._12_4_ = auVar196._12_4_ * auVar205._12_4_;
              auVar175._16_4_ = auVar196._16_4_ * auVar205._16_4_;
              auVar175._20_4_ = auVar196._20_4_ * auVar205._20_4_;
              auVar175._24_4_ = auVar196._24_4_ * auVar205._24_4_;
              auVar175._28_4_ = 0;
              auVar136 = vfmsub231ps_fma(auVar175,auVar101,auVar102);
              auVar61._4_4_ = auVar101._4_4_ * auVar100._4_4_;
              auVar61._0_4_ = auVar101._0_4_ * auVar100._0_4_;
              auVar61._8_4_ = auVar101._8_4_ * auVar100._8_4_;
              auVar61._12_4_ = auVar101._12_4_ * auVar100._12_4_;
              auVar61._16_4_ = auVar101._16_4_ * auVar100._16_4_;
              auVar61._20_4_ = auVar101._20_4_ * auVar100._20_4_;
              auVar61._24_4_ = auVar101._24_4_ * auVar100._24_4_;
              auVar61._28_4_ = auVar100._28_4_;
              auVar94 = vfmsub231ps_fma(auVar61,auVar205,auVar146);
              auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar136),ZEXT1632(auVar94));
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar121),ZEXT832(0) << 0x20);
              auVar130 = vrcpps_avx(ZEXT1632(auVar95));
              auVar206._8_4_ = 0x3f800000;
              auVar206._0_8_ = &DAT_3f8000003f800000;
              auVar206._12_4_ = 0x3f800000;
              auVar206._16_4_ = 0x3f800000;
              auVar206._20_4_ = 0x3f800000;
              auVar206._24_4_ = 0x3f800000;
              auVar206._28_4_ = 0x3f800000;
              auVar207 = ZEXT3264(auVar206);
              auVar96 = vfnmadd213ps_fma(auVar130,ZEXT1632(auVar95),auVar206);
              auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar130,auVar130);
              auVar62._4_4_ = auVar94._4_4_ * auVar107._4_4_;
              auVar62._0_4_ = auVar94._0_4_ * auVar107._0_4_;
              auVar62._8_4_ = auVar94._8_4_ * auVar107._8_4_;
              auVar62._12_4_ = auVar94._12_4_ * auVar107._12_4_;
              auVar62._16_4_ = auVar107._16_4_ * 0.0;
              auVar62._20_4_ = auVar107._20_4_ * 0.0;
              auVar62._24_4_ = auVar107._24_4_ * 0.0;
              auVar62._28_4_ = auVar107._28_4_;
              auVar136 = vfmadd231ps_fma(auVar62,auVar109,ZEXT1632(auVar136));
              auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar99,ZEXT1632(auVar121));
              fVar134 = auVar96._0_4_;
              fVar135 = auVar96._4_4_;
              fVar111 = auVar96._8_4_;
              fVar113 = auVar96._12_4_;
              auVar107 = ZEXT1632(CONCAT412(fVar113 * auVar136._12_4_,
                                            CONCAT48(fVar111 * auVar136._8_4_,
                                                     CONCAT44(fVar135 * auVar136._4_4_,
                                                              fVar134 * auVar136._0_4_))));
              uVar118 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar154._4_4_ = uVar118;
              auVar154._0_4_ = uVar118;
              auVar154._8_4_ = uVar118;
              auVar154._12_4_ = uVar118;
              auVar154._16_4_ = uVar118;
              auVar154._20_4_ = uVar118;
              auVar154._24_4_ = uVar118;
              auVar154._28_4_ = uVar118;
              auVar76._4_4_ = uStack_fc;
              auVar76._0_4_ = local_100;
              auVar76._8_4_ = uStack_f8;
              auVar76._12_4_ = uStack_f4;
              auVar76._16_4_ = uStack_f0;
              auVar76._20_4_ = uStack_ec;
              auVar76._24_4_ = uStack_e8;
              auVar76._28_4_ = uStack_e4;
              auVar99 = vcmpps_avx(auVar76,auVar107,2);
              auVar109 = vcmpps_avx(auVar107,auVar154,2);
              auVar99 = vandps_avx(auVar109,auVar99);
              auVar96 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
              auVar13 = vpand_avx(auVar13,auVar96);
              auVar99 = vpmovsxwd_avx2(auVar13);
              if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar99 >> 0x7f,0) == '\0') &&
                    (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar99 >> 0xbf,0) == '\0') &&
                  (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar99[0x1f]) goto LAB_016a5259;
              auVar99 = vcmpps_avx(ZEXT1632(auVar95),ZEXT832(0) << 0x20,4);
              auVar96 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
              auVar13 = vpand_avx(auVar13,auVar96);
              auVar99 = vpmovsxwd_avx2(auVar13);
              auVar155._8_8_ = uStack_5f8;
              auVar155._0_8_ = local_600;
              auVar155._16_8_ = uStack_5f0;
              auVar155._24_8_ = uStack_5e8;
              if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar99 >> 0x7f,0) != '\0') ||
                    (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar99 >> 0xbf,0) != '\0') ||
                  (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar99[0x1f] < '\0') {
                auVar130 = ZEXT1632(CONCAT412(fVar113 * auVar14._12_4_,
                                              CONCAT48(fVar111 * auVar14._8_4_,
                                                       CONCAT44(fVar135 * auVar14._4_4_,
                                                                fVar134 * auVar14._0_4_))));
                auVar63._28_4_ = SUB84(uStack_5e8,4);
                auVar63._0_28_ =
                     ZEXT1628(CONCAT412(fVar113 * auVar15._12_4_,
                                        CONCAT48(fVar111 * auVar15._8_4_,
                                                 CONCAT44(fVar135 * auVar15._4_4_,
                                                          fVar134 * auVar15._0_4_))));
                auVar186._8_4_ = 0x3f800000;
                auVar186._0_8_ = &DAT_3f8000003f800000;
                auVar186._12_4_ = 0x3f800000;
                auVar186._16_4_ = 0x3f800000;
                auVar186._20_4_ = 0x3f800000;
                auVar186._24_4_ = 0x3f800000;
                auVar186._28_4_ = 0x3f800000;
                auVar109 = vsubps_avx(auVar186,auVar130);
                _local_300 = vblendvps_avx(auVar109,auVar130,auVar184);
                auVar109 = vsubps_avx(auVar186,auVar63);
                local_500 = vblendvps_avx(auVar109,auVar63,auVar184);
                auVar155 = auVar99;
                local_560 = auVar107;
              }
            }
            auVar197 = ZEXT3264(auVar124);
            local_5e0 = auVar132;
            if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar155 >> 0x7f,0) == '\0') &&
                  (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar155 >> 0xbf,0) == '\0') &&
                (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar155[0x1f]) {
              auVar156 = ZEXT3264(local_760);
              auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,CONCAT416(
                                                  fVar110,CONCAT412(fVar112,CONCAT48(fVar110,uVar92)
                                                                   ))))));
              auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(
                                                  fVar202,CONCAT412(fVar202,CONCAT48(fVar202,
                                                  CONCAT44(fVar202,fVar202))))))));
            }
            else {
              auVar99 = vsubps_avx(auVar132,auVar125);
              auVar13 = vfmadd213ps_fma(auVar99,_local_300,auVar125);
              fVar134 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar64._4_4_ = (auVar13._4_4_ + auVar13._4_4_) * fVar134;
              auVar64._0_4_ = (auVar13._0_4_ + auVar13._0_4_) * fVar134;
              auVar64._8_4_ = (auVar13._8_4_ + auVar13._8_4_) * fVar134;
              auVar64._12_4_ = (auVar13._12_4_ + auVar13._12_4_) * fVar134;
              auVar64._16_4_ = fVar134 * 0.0;
              auVar64._20_4_ = fVar134 * 0.0;
              auVar64._24_4_ = fVar134 * 0.0;
              auVar64._28_4_ = fVar134;
              auVar99 = vcmpps_avx(local_560,auVar64,6);
              auVar109 = auVar155 & auVar99;
              auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,CONCAT416(
                                                  fVar110,CONCAT412(fVar112,CONCAT48(fVar110,uVar92)
                                                                   ))))));
              auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(
                                                  fVar202,CONCAT412(fVar202,CONCAT48(fVar202,
                                                  CONCAT44(fVar202,fVar202))))))));
              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar109 >> 0x7f,0) == '\0') &&
                    (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar109 >> 0xbf,0) == '\0') &&
                  (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar109[0x1f]) {
                auVar156 = ZEXT3264(local_760);
              }
              else {
                local_380 = vandps_avx(auVar99,auVar155);
                auVar133._8_4_ = 0xbf800000;
                auVar133._0_8_ = 0xbf800000bf800000;
                auVar133._12_4_ = 0xbf800000;
                auVar133._16_4_ = 0xbf800000;
                auVar133._20_4_ = 0xbf800000;
                auVar133._24_4_ = 0xbf800000;
                auVar133._28_4_ = 0xbf800000;
                auVar147._8_4_ = 0x40000000;
                auVar147._0_8_ = 0x4000000040000000;
                auVar147._12_4_ = 0x40000000;
                auVar147._16_4_ = 0x40000000;
                auVar147._20_4_ = 0x40000000;
                auVar147._24_4_ = 0x40000000;
                auVar147._28_4_ = 0x40000000;
                auVar13 = vfmadd213ps_fma(local_500,auVar147,auVar133);
                local_440 = _local_300;
                local_420 = ZEXT1632(auVar13);
                local_3d0 = local_730._0_8_;
                uStack_3c8 = local_730._8_8_;
                local_3c0 = local_620._0_8_;
                uStack_3b8 = local_620._8_8_;
                local_3b0 = local_630._0_8_;
                uStack_3a8 = local_630._8_8_;
                local_3a0 = local_570._0_8_;
                uStack_398 = local_570._8_8_;
                pGVar8 = (context->scene->geometries).items[uVar89].ptr;
                local_500 = local_420;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar81 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar81 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar134 = (float)local_3e0;
                  local_360[0] = (fVar134 + (float)local_300._0_4_ + 0.0) * local_160;
                  local_360[1] = (fVar134 + (float)local_300._4_4_ + 1.0) * fStack_15c;
                  local_360[2] = (fVar134 + fStack_2f8 + 2.0) * fStack_158;
                  local_360[3] = (fVar134 + fStack_2f4 + 3.0) * fStack_154;
                  fStack_350 = (fVar134 + fStack_2f0 + 4.0) * fStack_150;
                  fStack_34c = (fVar134 + fStack_2ec + 5.0) * fStack_14c;
                  fStack_348 = (fVar134 + fStack_2e8 + 6.0) * fStack_148;
                  fStack_344 = fVar134 + fStack_2e4 + 7.0;
                  local_500._0_8_ = auVar13._0_8_;
                  local_500._8_8_ = auVar13._8_8_;
                  local_340 = local_500._0_8_;
                  uStack_338 = local_500._8_8_;
                  uStack_330 = 0;
                  uStack_328 = 0;
                  local_320 = local_560;
                  uVar84 = vmovmskps_avx(local_380);
                  local_7a0._4_28_ = auVar152._4_28_;
                  local_7a0._0_4_ = (int)CONCAT71((int7)((ulong)pGVar8 >> 8),uVar84 != 0);
                  if (uVar84 != 0) {
                    uVar85 = (ulong)(uVar84 & 0xff);
                    local_960 = ZEXT1632(CONCAT88(auVar10._8_8_,uVar85));
                    lVar90 = 0;
                    for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                      lVar90 = lVar90 + 1;
                    }
                    local_9a0 = ZEXT1632(CONCAT88(auVar12._8_8_,lVar90));
                    local_6c0 = ZEXT1632(local_620);
                    local_780 = ZEXT1632(local_630);
                    _local_6e0 = ZEXT1632(local_570);
                    _local_540 = *pauVar2;
                    local_400 = local_560;
                    local_3dc = iVar83;
                    do {
                      uVar118 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_220 = local_360[local_9a0._0_8_];
                      local_200._4_4_ = *(undefined4 *)((long)&local_340 + local_9a0._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_320 + local_9a0._0_8_ * 4);
                      fVar111 = 1.0 - local_220;
                      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * fVar111)),
                                                ZEXT416((uint)(local_220 * fVar111)),
                                                ZEXT416(0xc0000000));
                      auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar111)),
                                                ZEXT416((uint)(local_220 * local_220)),
                                                ZEXT416(0x40000000));
                      fVar134 = auVar10._0_4_ * 3.0;
                      fVar135 = local_220 * local_220 * 3.0;
                      auVar165._0_4_ = fVar135 * (float)local_6e0._0_4_;
                      auVar165._4_4_ = fVar135 * (float)local_6e0._4_4_;
                      auVar165._8_4_ = fVar135 * fStack_6d8;
                      auVar165._12_4_ = fVar135 * fStack_6d4;
                      auVar139._4_4_ = fVar134;
                      auVar139._0_4_ = fVar134;
                      auVar139._8_4_ = fVar134;
                      auVar139._12_4_ = fVar134;
                      auVar10 = vfmadd132ps_fma(auVar139,auVar165,local_780._0_16_);
                      fVar134 = auVar12._0_4_ * 3.0;
                      auVar159._4_4_ = fVar134;
                      auVar159._0_4_ = fVar134;
                      auVar159._8_4_ = fVar134;
                      auVar159._12_4_ = fVar134;
                      auVar10 = vfmadd132ps_fma(auVar159,auVar10,local_6c0._0_16_);
                      fVar134 = fVar111 * fVar111 * -3.0;
                      local_7d0.context = context->user;
                      auVar140._4_4_ = fVar134;
                      auVar140._0_4_ = fVar134;
                      auVar140._8_4_ = fVar134;
                      auVar140._12_4_ = fVar134;
                      auVar12 = vfmadd132ps_fma(auVar140,auVar10,local_730);
                      local_280 = auVar12._0_4_;
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      auVar10 = vmovshdup_avx(auVar12);
                      local_260 = auVar10._0_8_;
                      uStack_258 = local_260;
                      uStack_250 = local_260;
                      uStack_248 = local_260;
                      auVar10 = vshufps_avx(auVar12,auVar12,0xaa);
                      local_240 = auVar10._0_8_;
                      uStack_238 = local_240;
                      uStack_230 = local_240;
                      uStack_228 = local_240;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      local_200._0_4_ = local_200._4_4_;
                      local_200._8_4_ = local_200._4_4_;
                      local_200._12_4_ = local_200._4_4_;
                      local_200._16_4_ = local_200._4_4_;
                      local_200._20_4_ = local_200._4_4_;
                      local_200._24_4_ = local_200._4_4_;
                      local_200._28_4_ = local_200._4_4_;
                      local_1e0 = CONCAT44(uStack_13c,local_140);
                      uStack_1d8 = CONCAT44(uStack_134,uStack_138);
                      uStack_1d0 = CONCAT44(uStack_12c,uStack_130);
                      uStack_1c8 = CONCAT44(uStack_124,uStack_128);
                      local_1c0._4_4_ = uStack_11c;
                      local_1c0._0_4_ = local_120;
                      local_1c0._8_4_ = uStack_118;
                      local_1c0._12_4_ = uStack_114;
                      local_1c0._16_4_ = uStack_110;
                      local_1c0._20_4_ = uStack_10c;
                      local_1c0._24_4_ = uStack_108;
                      local_1c0._28_4_ = uStack_104;
                      vpcmpeqd_avx2(local_1c0,local_1c0);
                      local_1a0 = (local_7d0.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_7d0.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_660 = local_2e0._0_8_;
                      uStack_658 = local_2e0._8_8_;
                      uStack_650 = local_2e0._16_8_;
                      uStack_648 = local_2e0._24_8_;
                      local_7d0.valid = (int *)&local_660;
                      local_7d0.geometryUserPtr = pGVar8->userPtr;
                      local_7d0.hit = (RTCHitN *)&local_280;
                      local_7d0.N = 8;
                      local_7d0.ray = (RTCRayN *)ray;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar207 = ZEXT1664(auVar207._0_16_);
                        (*pGVar8->occlusionFilterN)(&local_7d0);
                      }
                      auVar73._8_8_ = uStack_658;
                      auVar73._0_8_ = local_660;
                      auVar73._16_8_ = uStack_650;
                      auVar73._24_8_ = uStack_648;
                      auVar109 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar73);
                      auVar99 = _DAT_0205a980 & ~auVar109;
                      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar99 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar99 >> 0x7f,0) == '\0') &&
                            (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar99 >> 0xbf,0) == '\0') &&
                          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar99[0x1f]) {
                        auVar109 = auVar109 ^ _DAT_0205a980;
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar207 = ZEXT1664(auVar207._0_16_);
                          (*p_Var9)(&local_7d0);
                        }
                        auVar74._8_8_ = uStack_658;
                        auVar74._0_8_ = local_660;
                        auVar74._16_8_ = uStack_650;
                        auVar74._24_8_ = uStack_648;
                        auVar99 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar74);
                        auVar109 = auVar99 ^ _DAT_0205a980;
                        auVar148._8_4_ = 0xff800000;
                        auVar148._0_8_ = 0xff800000ff800000;
                        auVar148._12_4_ = 0xff800000;
                        auVar148._16_4_ = 0xff800000;
                        auVar148._20_4_ = 0xff800000;
                        auVar148._24_4_ = 0xff800000;
                        auVar148._28_4_ = 0xff800000;
                        auVar99 = vblendvps_avx(auVar148,*(undefined1 (*) [32])
                                                          (local_7d0.ray + 0x100),auVar99);
                        *(undefined1 (*) [32])(local_7d0.ray + 0x100) = auVar99;
                      }
                      if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar109 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar109 >> 0x7f,0) != '\0') ||
                            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar109 >> 0xbf,0) != '\0') ||
                          (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar109[0x1f] < '\0') break;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar118;
                      uVar87 = local_960._0_8_ ^ 1L << (local_9a0._0_8_ & 0x3f);
                      local_960._0_8_ = uVar87;
                      lVar90 = 0;
                      for (uVar85 = uVar87; (uVar85 & 1) == 0;
                          uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                        lVar90 = lVar90 + 1;
                      }
                      local_9a0._0_8_ = lVar90;
                      local_7a0._0_4_ = (int)CONCAT71((int7)((ulong)lVar90 >> 8),uVar87 != 0);
                    } while (uVar87 != 0);
                  }
                  bVar81 = local_7a0[0] & 1;
                  auVar176 = ZEXT3264(CONCAT428(fVar112,CONCAT424(fVar110,CONCAT420(fVar112,
                                                  CONCAT416(fVar110,CONCAT412(fVar112,CONCAT48(
                                                  fVar110,uVar92)))))));
                  auVar187 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,
                                                  CONCAT416(fVar202,CONCAT412(fVar202,CONCAT48(
                                                  fVar202,CONCAT44(fVar202,fVar202))))))));
                }
                auVar197 = ZEXT3264(auVar124);
                bVar91 = (bool)(bVar91 | bVar81);
                auVar156 = ZEXT3264(local_760);
              }
            }
          }
          lVar86 = lVar86 + 8;
        } while ((int)lVar86 < iVar83);
      }
      if (bVar91 != false) {
        return local_9ad;
      }
      uVar118 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar98._4_4_ = uVar118;
      auVar98._0_4_ = uVar118;
      auVar98._8_4_ = uVar118;
      auVar98._12_4_ = uVar118;
      auVar10 = vcmpps_avx(local_460,auVar98,2);
      uVar89 = vmovmskps_avx(auVar10);
      uVar82 = uVar82 & uVar82 + 0xf & uVar89;
      local_9ad = uVar82 != 0;
    } while (local_9ad);
  }
  return local_9ad;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }